

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  uint uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  uint uVar86;
  long lVar87;
  long lVar88;
  undefined4 uVar89;
  undefined8 unaff_R13;
  uint uVar90;
  bool bVar91;
  float fVar92;
  float fVar119;
  float fVar121;
  vint4 ai;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar123;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar120;
  float fVar122;
  float fVar124;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar128;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar156;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  float fVar155;
  float fVar157;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar172;
  float fVar173;
  vint4 bi_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar165 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar198;
  float fVar199;
  vint4 bi;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar206;
  float fVar228;
  float fVar229;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [28];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar234;
  float fVar253;
  float fVar254;
  vint4 ai_1;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [28];
  float fVar256;
  float fVar257;
  undefined1 auVar243 [32];
  float fVar255;
  float fVar258;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar259;
  float fVar276;
  float fVar280;
  vint4 bi_1;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar265 [16];
  undefined1 auVar263 [16];
  float fVar284;
  undefined1 auVar264 [16];
  float fVar277;
  float fVar278;
  float fVar281;
  float fVar282;
  float fVar285;
  float fVar286;
  float fVar289;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar298;
  undefined1 auVar270 [32];
  float fVar279;
  float fVar283;
  float fVar287;
  float fVar290;
  float fVar293;
  float fVar296;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [28];
  float fVar288;
  float fVar291;
  undefined1 auVar269 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [64];
  vint4 ai_2;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar307;
  float fVar313;
  float fVar314;
  undefined1 auVar308 [16];
  float fVar315;
  undefined1 auVar310 [32];
  float fVar316;
  undefined1 auVar311 [32];
  undefined1 auVar309 [16];
  undefined1 auVar312 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  float fVar320;
  float fVar321;
  float fVar327;
  float fVar329;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar331;
  float fVar333;
  float fVar334;
  float fVar335;
  undefined1 auVar325 [32];
  float fVar328;
  float fVar330;
  float fVar332;
  undefined1 auVar326 [32];
  float fVar336;
  float fVar344;
  float fVar345;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar340 [32];
  float fVar346;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar350;
  float fVar356;
  float fVar357;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [64];
  float fVar363;
  float fVar364;
  float fVar368;
  float fVar370;
  undefined1 auVar365 [16];
  float fVar369;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar381 [16];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [16];
  undefined1 auVar385 [28];
  float fVar387;
  float fVar388;
  float fVar389;
  undefined1 auVar386 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c48;
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float local_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float local_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8c8;
  ulong local_8c0;
  undefined1 auStack_8b8 [24];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  undefined1 auStack_6e0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar9 = prim[1];
  uVar82 = (ulong)(byte)PVar9;
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  lVar88 = uVar82 * 0x25;
  auVar265 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xf + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x11 + 6)));
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1a + 6)));
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1b + 6)));
  auVar184 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar184 = vinsertps_avx(auVar184,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar184 = vsubps_avx(auVar184,*(undefined1 (*) [16])(prim + lVar88 + 6));
  fVar320 = *(float *)(prim + lVar88 + 0x12);
  auVar207._0_4_ = fVar320 * auVar184._0_4_;
  auVar207._4_4_ = fVar320 * auVar184._4_4_;
  auVar207._8_4_ = fVar320 * auVar184._8_4_;
  auVar207._12_4_ = fVar320 * auVar184._12_4_;
  auVar322._0_4_ = fVar320 * auVar16._0_4_;
  auVar322._4_4_ = fVar320 * auVar16._4_4_;
  auVar322._8_4_ = fVar320 * auVar16._8_4_;
  auVar322._12_4_ = fVar320 * auVar16._12_4_;
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar16 = vshufps_avx(auVar322,auVar322,0x55);
  auVar28 = vshufps_avx(auVar322,auVar322,0xaa);
  fVar259 = auVar28._0_4_;
  fVar276 = auVar28._4_4_;
  fVar280 = auVar28._8_4_;
  fVar284 = auVar28._12_4_;
  fVar172 = auVar16._0_4_;
  fVar173 = auVar16._4_4_;
  fVar174 = auVar16._8_4_;
  fVar175 = auVar16._12_4_;
  auVar28 = vcvtdq2ps_avx(auVar24);
  auVar265 = vcvtdq2ps_avx(auVar265);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar99 = vcvtdq2ps_avx(auVar184);
  auVar184 = vshufps_avx(auVar322,auVar322,0);
  fVar320 = auVar184._0_4_;
  fVar327 = auVar184._4_4_;
  fVar329 = auVar184._8_4_;
  fVar331 = auVar184._12_4_;
  auVar308._0_4_ = fVar320 * auVar28._0_4_ + fVar172 * auVar130._0_4_ + fVar259 * auVar25._0_4_;
  auVar308._4_4_ = fVar327 * auVar28._4_4_ + fVar173 * auVar130._4_4_ + fVar276 * auVar25._4_4_;
  auVar308._8_4_ = fVar329 * auVar28._8_4_ + fVar174 * auVar130._8_4_ + fVar280 * auVar25._8_4_;
  auVar308._12_4_ = fVar331 * auVar28._12_4_ + fVar175 * auVar130._12_4_ + fVar284 * auVar25._12_4_;
  auVar105._0_4_ = fVar320 * auVar265._0_4_ + fVar172 * auVar26._0_4_ + fVar259 * auVar27._0_4_;
  auVar105._4_4_ = fVar327 * auVar265._4_4_ + fVar173 * auVar26._4_4_ + fVar276 * auVar27._4_4_;
  auVar105._8_4_ = fVar329 * auVar265._8_4_ + fVar174 * auVar26._8_4_ + fVar280 * auVar27._8_4_;
  auVar105._12_4_ = fVar331 * auVar265._12_4_ + fVar175 * auVar26._12_4_ + fVar284 * auVar27._12_4_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar184);
  auVar184 = vcvtdq2ps_avx(auVar161);
  auVar323._0_4_ = fVar172 * auVar187._0_4_ + fVar259 * auVar99._0_4_ + fVar320 * auVar184._0_4_;
  auVar323._4_4_ = fVar173 * auVar187._4_4_ + fVar276 * auVar99._4_4_ + fVar327 * auVar184._4_4_;
  auVar323._8_4_ = fVar174 * auVar187._8_4_ + fVar280 * auVar99._8_4_ + fVar329 * auVar184._8_4_;
  auVar323._12_4_ = fVar175 * auVar187._12_4_ + fVar284 * auVar99._12_4_ + fVar331 * auVar184._12_4_
  ;
  auVar16 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar259 = auVar16._0_4_;
  fVar276 = auVar16._4_4_;
  fVar280 = auVar16._8_4_;
  fVar284 = auVar16._12_4_;
  auVar16 = vshufps_avx(auVar207,auVar207,0x55);
  fVar320 = auVar16._0_4_;
  fVar329 = auVar16._4_4_;
  fVar172 = auVar16._8_4_;
  fVar174 = auVar16._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar161 = vpmovsxwd_avx(auVar16);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar94 = vpmovsxwd_avx(auVar24);
  auVar16 = vshufps_avx(auVar207,auVar207,0);
  fVar327 = auVar16._0_4_;
  fVar331 = auVar16._4_4_;
  fVar173 = auVar16._8_4_;
  fVar175 = auVar16._12_4_;
  auVar317._0_4_ = auVar28._0_4_ * fVar327 + auVar130._0_4_ * fVar320 + fVar259 * auVar25._0_4_;
  auVar317._4_4_ = auVar28._4_4_ * fVar331 + auVar130._4_4_ * fVar329 + fVar276 * auVar25._4_4_;
  auVar317._8_4_ = auVar28._8_4_ * fVar173 + auVar130._8_4_ * fVar172 + fVar280 * auVar25._8_4_;
  auVar317._12_4_ = auVar28._12_4_ * fVar175 + auVar130._12_4_ * fVar174 + fVar284 * auVar25._12_4_;
  auVar299._0_4_ = auVar27._0_4_ * fVar259 + auVar26._0_4_ * fVar320 + fVar327 * auVar265._0_4_;
  auVar299._4_4_ = auVar27._4_4_ * fVar276 + auVar26._4_4_ * fVar329 + fVar331 * auVar265._4_4_;
  auVar299._8_4_ = auVar27._8_4_ * fVar280 + auVar26._8_4_ * fVar172 + fVar173 * auVar265._8_4_;
  auVar299._12_4_ = auVar27._12_4_ * fVar284 + auVar26._12_4_ * fVar174 + fVar175 * auVar265._12_4_;
  auVar208._0_4_ = auVar184._0_4_ * fVar327 + fVar320 * auVar187._0_4_ + fVar259 * auVar99._0_4_;
  auVar208._4_4_ = auVar184._4_4_ * fVar331 + fVar329 * auVar187._4_4_ + fVar276 * auVar99._4_4_;
  auVar208._8_4_ = auVar184._8_4_ * fVar173 + fVar172 * auVar187._8_4_ + fVar280 * auVar99._8_4_;
  auVar208._12_4_ = auVar184._12_4_ * fVar175 + fVar174 * auVar187._12_4_ + fVar284 * auVar99._12_4_
  ;
  auVar351._8_4_ = 0x7fffffff;
  auVar351._0_8_ = 0x7fffffff7fffffff;
  auVar351._12_4_ = 0x7fffffff;
  auVar184 = vandps_avx(auVar308,auVar351);
  auVar337._8_4_ = 0x219392ef;
  auVar337._0_8_ = 0x219392ef219392ef;
  auVar337._12_4_ = 0x219392ef;
  auVar184 = vcmpps_avx(auVar184,auVar337,1);
  auVar16 = vblendvps_avx(auVar308,auVar337,auVar184);
  auVar184 = vandps_avx(auVar351,auVar105);
  auVar184 = vcmpps_avx(auVar184,auVar337,1);
  auVar24 = vblendvps_avx(auVar105,auVar337,auVar184);
  auVar184 = vandps_avx(auVar323,auVar351);
  auVar184 = vcmpps_avx(auVar184,auVar337,1);
  auVar184 = vblendvps_avx(auVar323,auVar337,auVar184);
  auVar130 = vrcpps_avx(auVar16);
  fVar259 = auVar130._0_4_;
  auVar263._0_4_ = fVar259 * auVar16._0_4_;
  fVar276 = auVar130._4_4_;
  auVar263._4_4_ = fVar276 * auVar16._4_4_;
  fVar280 = auVar130._8_4_;
  auVar263._8_4_ = fVar280 * auVar16._8_4_;
  fVar284 = auVar130._12_4_;
  auVar263._12_4_ = fVar284 * auVar16._12_4_;
  auVar338._8_4_ = 0x3f800000;
  auVar338._0_8_ = 0x3f8000003f800000;
  auVar338._12_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar338,auVar263);
  fVar259 = fVar259 + fVar259 * auVar16._0_4_;
  fVar276 = fVar276 + fVar276 * auVar16._4_4_;
  fVar280 = fVar280 + fVar280 * auVar16._8_4_;
  fVar284 = fVar284 + fVar284 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar24);
  fVar307 = auVar16._0_4_;
  auVar101._0_4_ = fVar307 * auVar24._0_4_;
  fVar313 = auVar16._4_4_;
  auVar101._4_4_ = fVar313 * auVar24._4_4_;
  fVar314 = auVar16._8_4_;
  auVar101._8_4_ = fVar314 * auVar24._8_4_;
  fVar315 = auVar16._12_4_;
  auVar101._12_4_ = fVar315 * auVar24._12_4_;
  auVar16 = vsubps_avx(auVar338,auVar101);
  fVar307 = fVar307 + fVar307 * auVar16._0_4_;
  fVar313 = fVar313 + fVar313 * auVar16._4_4_;
  fVar314 = fVar314 + fVar314 * auVar16._8_4_;
  fVar315 = fVar315 + fVar315 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar184);
  fVar320 = auVar16._0_4_;
  auVar324._0_4_ = auVar184._0_4_ * fVar320;
  fVar327 = auVar16._4_4_;
  auVar324._4_4_ = auVar184._4_4_ * fVar327;
  fVar329 = auVar16._8_4_;
  auVar324._8_4_ = auVar184._8_4_ * fVar329;
  fVar331 = auVar16._12_4_;
  auVar324._12_4_ = auVar184._12_4_ * fVar331;
  auVar184 = vsubps_avx(auVar338,auVar324);
  fVar320 = auVar184._0_4_ * fVar320 + fVar320;
  fVar327 = auVar184._4_4_ * fVar327 + fVar327;
  fVar329 = auVar184._8_4_ * fVar329 + fVar329;
  fVar331 = auVar184._12_4_ * fVar331 + fVar331;
  auVar24 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar88 + 0x16)) *
                                        *(float *)(prim + lVar88 + 0x1a))),0);
  auVar184 = vcvtdq2ps_avx(auVar93);
  auVar16 = vcvtdq2ps_avx(auVar161);
  auVar16 = vsubps_avx(auVar16,auVar184);
  fVar172 = auVar24._0_4_;
  fVar173 = auVar24._4_4_;
  fVar174 = auVar24._8_4_;
  fVar175 = auVar24._12_4_;
  auVar93._0_4_ = fVar172 * auVar16._0_4_ + auVar184._0_4_;
  auVar93._4_4_ = fVar173 * auVar16._4_4_ + auVar184._4_4_;
  auVar93._8_4_ = fVar174 * auVar16._8_4_ + auVar184._8_4_;
  auVar93._12_4_ = fVar175 * auVar16._12_4_ + auVar184._12_4_;
  auVar184 = vcvtdq2ps_avx(auVar94);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar82 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar130);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar24 = vsubps_avx(auVar16,auVar184);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar82 * 0x12 + 6);
  auVar16 = vpmovsxwd_avx(auVar25);
  auVar176._0_4_ = fVar172 * auVar24._0_4_ + auVar184._0_4_;
  auVar176._4_4_ = fVar173 * auVar24._4_4_ + auVar184._4_4_;
  auVar176._8_4_ = fVar174 * auVar24._8_4_ + auVar184._8_4_;
  auVar176._12_4_ = fVar175 * auVar24._12_4_ + auVar184._12_4_;
  auVar184 = vcvtdq2ps_avx(auVar16);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar82 * 0x16 + 6);
  auVar16 = vpmovsxwd_avx(auVar26);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar184);
  auVar235._0_4_ = auVar16._0_4_ * fVar172 + auVar184._0_4_;
  auVar235._4_4_ = auVar16._4_4_ * fVar173 + auVar184._4_4_;
  auVar235._8_4_ = auVar16._8_4_ * fVar174 + auVar184._8_4_;
  auVar235._12_4_ = auVar16._12_4_ * fVar175 + auVar184._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar82 * 0x14 + 6);
  auVar184 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar82 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar28);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar184);
  auVar339._0_4_ = auVar16._0_4_ * fVar172 + auVar184._0_4_;
  auVar339._4_4_ = auVar16._4_4_ * fVar173 + auVar184._4_4_;
  auVar339._8_4_ = auVar16._8_4_ * fVar174 + auVar184._8_4_;
  auVar339._12_4_ = auVar16._12_4_ * fVar175 + auVar184._12_4_;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + uVar82 * 0x1d + 6);
  auVar184 = vpmovsxwd_avx(auVar265);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar82 * 0x21 + 6);
  auVar16 = vpmovsxwd_avx(auVar187);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar184);
  auVar352._0_4_ = auVar16._0_4_ * fVar172 + auVar184._0_4_;
  auVar352._4_4_ = auVar16._4_4_ * fVar173 + auVar184._4_4_;
  auVar352._8_4_ = auVar16._8_4_ * fVar174 + auVar184._8_4_;
  auVar352._12_4_ = auVar16._12_4_ * fVar175 + auVar184._12_4_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar82 * 0x1f + 6);
  auVar184 = vpmovsxwd_avx(auVar99);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar82 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar161);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar184);
  auVar158._0_4_ = auVar184._0_4_ + auVar16._0_4_ * fVar172;
  auVar158._4_4_ = auVar184._4_4_ + auVar16._4_4_ * fVar173;
  auVar158._8_4_ = auVar184._8_4_ + auVar16._8_4_ * fVar174;
  auVar158._12_4_ = auVar184._12_4_ + auVar16._12_4_ * fVar175;
  auVar184 = vsubps_avx(auVar93,auVar317);
  auVar94._0_4_ = fVar259 * auVar184._0_4_;
  auVar94._4_4_ = fVar276 * auVar184._4_4_;
  auVar94._8_4_ = fVar280 * auVar184._8_4_;
  auVar94._12_4_ = fVar284 * auVar184._12_4_;
  auVar184 = vsubps_avx(auVar176,auVar317);
  auVar177._0_4_ = fVar259 * auVar184._0_4_;
  auVar177._4_4_ = fVar276 * auVar184._4_4_;
  auVar177._8_4_ = fVar280 * auVar184._8_4_;
  auVar177._12_4_ = fVar284 * auVar184._12_4_;
  auVar184 = vsubps_avx(auVar235,auVar299);
  auVar236._0_4_ = fVar307 * auVar184._0_4_;
  auVar236._4_4_ = fVar313 * auVar184._4_4_;
  auVar236._8_4_ = fVar314 * auVar184._8_4_;
  auVar236._12_4_ = fVar315 * auVar184._12_4_;
  auVar184 = vsubps_avx(auVar339,auVar299);
  auVar264._0_4_ = fVar307 * auVar184._0_4_;
  auVar264._4_4_ = fVar313 * auVar184._4_4_;
  auVar264._8_4_ = fVar314 * auVar184._8_4_;
  auVar264._12_4_ = fVar315 * auVar184._12_4_;
  auVar184 = vsubps_avx(auVar352,auVar208);
  auVar300._0_4_ = fVar320 * auVar184._0_4_;
  auVar300._4_4_ = fVar327 * auVar184._4_4_;
  auVar300._8_4_ = fVar329 * auVar184._8_4_;
  auVar300._12_4_ = fVar331 * auVar184._12_4_;
  auVar184 = vsubps_avx(auVar158,auVar208);
  auVar159._0_4_ = fVar320 * auVar184._0_4_;
  auVar159._4_4_ = fVar327 * auVar184._4_4_;
  auVar159._8_4_ = fVar329 * auVar184._8_4_;
  auVar159._12_4_ = fVar331 * auVar184._12_4_;
  auVar184 = vpminsd_avx(auVar94,auVar177);
  auVar16 = vpminsd_avx(auVar236,auVar264);
  auVar184 = vmaxps_avx(auVar184,auVar16);
  auVar16 = vpminsd_avx(auVar300,auVar159);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar318._4_4_ = uVar89;
  auVar318._0_4_ = uVar89;
  auVar318._8_4_ = uVar89;
  auVar318._12_4_ = uVar89;
  auVar16 = vmaxps_avx(auVar16,auVar318);
  auVar184 = vmaxps_avx(auVar184,auVar16);
  local_5e0._0_4_ = auVar184._0_4_ * 0.99999964;
  local_5e0._4_4_ = auVar184._4_4_ * 0.99999964;
  local_5e0._8_4_ = auVar184._8_4_ * 0.99999964;
  local_5e0._12_4_ = auVar184._12_4_ * 0.99999964;
  auVar184 = vpmaxsd_avx(auVar94,auVar177);
  auVar16 = vpmaxsd_avx(auVar236,auVar264);
  auVar184 = vminps_avx(auVar184,auVar16);
  auVar16 = vpmaxsd_avx(auVar300,auVar159);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar178._4_4_ = uVar89;
  auVar178._0_4_ = uVar89;
  auVar178._8_4_ = uVar89;
  auVar178._12_4_ = uVar89;
  auVar16 = vminps_avx(auVar16,auVar178);
  auVar184 = vminps_avx(auVar184,auVar16);
  auVar95._0_4_ = auVar184._0_4_ * 1.0000004;
  auVar95._4_4_ = auVar184._4_4_ * 1.0000004;
  auVar95._8_4_ = auVar184._8_4_ * 1.0000004;
  auVar95._12_4_ = auVar184._12_4_ * 1.0000004;
  auVar184 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar16 = vpcmpgtd_avx(auVar184,_DAT_01f4ad30);
  auVar184 = vcmpps_avx(local_5e0,auVar95,2);
  auVar184 = vandps_avx(auVar184,auVar16);
  uVar89 = vmovmskps_avx(auVar184);
  uVar82 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar89);
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  local_500 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8c8 = prim;
LAB_008f7484:
  if (uVar82 == 0) {
    return;
  }
  lVar88 = 0;
  if (uVar82 != 0) {
    for (; (uVar82 >> lVar88 & 1) == 0; lVar88 = lVar88 + 1) {
    }
  }
  uVar86 = *(uint *)(local_8c8 + 2);
  local_8c0 = (ulong)*(uint *)(local_8c8 + lVar88 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar86].ptr;
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           local_8c0 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar320 = (pGVar10->time_range).lower;
  fVar320 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar320) / ((pGVar10->time_range).upper - fVar320));
  auVar184 = vroundss_avx(ZEXT416((uint)fVar320),ZEXT416((uint)fVar320),9);
  auVar184 = vminss_avx(auVar184,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar184 = vmaxss_avx(ZEXT816(0) << 0x20,auVar184);
  fVar320 = fVar320 - auVar184._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar87 = (long)(int)auVar184._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + 0x10 + lVar87);
  lVar13 = *(long *)(_Var11 + 0x38 + lVar87);
  lVar14 = *(long *)(_Var11 + 0x48 + lVar87);
  auVar184 = vshufps_avx(ZEXT416((uint)fVar320),ZEXT416((uint)fVar320),0);
  pfVar2 = (float *)(lVar13 + lVar14 * uVar83);
  fVar175 = auVar184._0_4_;
  fVar259 = auVar184._4_4_;
  fVar276 = auVar184._8_4_;
  fVar280 = auVar184._12_4_;
  lVar1 = uVar83 + 1;
  pfVar3 = (float *)(lVar13 + lVar14 * lVar1);
  p_Var15 = pGVar10[4].occlusionFilterN;
  auVar184 = vshufps_avx(ZEXT416((uint)(1.0 - fVar320)),ZEXT416((uint)(1.0 - fVar320)),0);
  pfVar4 = (float *)(*(long *)(_Var11 + lVar87) + lVar12 * uVar83);
  fVar331 = auVar184._0_4_;
  fVar172 = auVar184._4_4_;
  fVar173 = auVar184._8_4_;
  fVar174 = auVar184._12_4_;
  pfVar5 = (float *)(*(long *)(_Var11 + lVar87) + lVar12 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var15 + lVar87 + 0x38) +
                    uVar83 * *(long *)(p_Var15 + lVar87 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var15 + lVar87 + 0x38) + *(long *)(p_Var15 + lVar87 + 0x48) * lVar1
                    );
  pfVar8 = (float *)(*(long *)(p_Var15 + lVar87) + *(long *)(p_Var15 + lVar87 + 0x10) * uVar83);
  auVar129._0_4_ = fVar331 * *pfVar4 + fVar175 * *pfVar2;
  auVar129._4_4_ = fVar172 * pfVar4[1] + fVar259 * pfVar2[1];
  auVar129._8_4_ = fVar173 * pfVar4[2] + fVar276 * pfVar2[2];
  auVar129._12_4_ = fVar174 * pfVar4[3] + fVar280 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var15 + lVar87) + *(long *)(p_Var15 + lVar87 + 0x10) * lVar1);
  auVar160._0_4_ = fVar331 * *pfVar5 + fVar175 * *pfVar3;
  auVar160._4_4_ = fVar172 * pfVar5[1] + fVar259 * pfVar3[1];
  auVar160._8_4_ = fVar173 * pfVar5[2] + fVar276 * pfVar3[2];
  auVar160._12_4_ = fVar174 * pfVar5[3] + fVar280 * pfVar3[3];
  auVar184 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar16 = vinsertps_avx(auVar184,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar320 = *(float *)(ray + k * 4 + 0x40);
  auVar365._4_4_ = fVar320;
  auVar365._0_4_ = fVar320;
  auVar365._8_4_ = fVar320;
  auVar365._12_4_ = fVar320;
  fStack_a10 = fVar320;
  _local_a20 = auVar365;
  fStack_a0c = fVar320;
  fStack_a08 = fVar320;
  fStack_a04 = fVar320;
  fVar327 = *(float *)(ray + k * 4 + 0x50);
  auVar381._4_4_ = fVar327;
  auVar381._0_4_ = fVar327;
  auVar381._8_4_ = fVar327;
  auVar381._12_4_ = fVar327;
  fStack_670 = fVar327;
  _local_680 = auVar381;
  fStack_66c = fVar327;
  fStack_668 = fVar327;
  fStack_664 = fVar327;
  auVar184 = vunpcklps_avx(auVar365,auVar381);
  fVar329 = *(float *)(ray + k * 4 + 0x60);
  auVar384._4_4_ = fVar329;
  auVar384._0_4_ = fVar329;
  auVar384._8_4_ = fVar329;
  auVar384._12_4_ = fVar329;
  fStack_870 = fVar329;
  _local_880 = auVar384;
  fStack_86c = fVar329;
  fStack_868 = fVar329;
  fStack_864 = fVar329;
  _local_9b0 = vinsertps_avx(auVar184,auVar384,0x28);
  auVar209._0_4_ = auVar129._0_4_ + (fVar331 * *pfVar8 + fVar175 * *pfVar6) * 0.33333334;
  auVar209._4_4_ = auVar129._4_4_ + (fVar172 * pfVar8[1] + fVar259 * pfVar6[1]) * 0.33333334;
  auVar209._8_4_ = auVar129._8_4_ + (fVar173 * pfVar8[2] + fVar276 * pfVar6[2]) * 0.33333334;
  auVar209._12_4_ = auVar129._12_4_ + (fVar174 * pfVar8[3] + fVar280 * pfVar6[3]) * 0.33333334;
  auVar96._0_4_ = (fVar331 * *pfVar2 + fVar175 * *pfVar7) * 0.33333334;
  auVar96._4_4_ = (fVar172 * pfVar2[1] + fVar259 * pfVar7[1]) * 0.33333334;
  auVar96._8_4_ = (fVar173 * pfVar2[2] + fVar276 * pfVar7[2]) * 0.33333334;
  auVar96._12_4_ = (fVar174 * pfVar2[3] + fVar280 * pfVar7[3]) * 0.33333334;
  auVar130 = vsubps_avx(auVar160,auVar96);
  auVar97._0_4_ = (auVar160._0_4_ + auVar129._0_4_ + auVar209._0_4_ + auVar130._0_4_) * 0.25;
  auVar97._4_4_ = (auVar160._4_4_ + auVar129._4_4_ + auVar209._4_4_ + auVar130._4_4_) * 0.25;
  auVar97._8_4_ = (auVar160._8_4_ + auVar129._8_4_ + auVar209._8_4_ + auVar130._8_4_) * 0.25;
  auVar97._12_4_ = (auVar160._12_4_ + auVar129._12_4_ + auVar209._12_4_ + auVar130._12_4_) * 0.25;
  auVar184 = vsubps_avx(auVar97,auVar16);
  auVar184 = vdpps_avx(auVar184,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar24 = vrcpss_avx(local_9c0,local_9c0);
  fVar331 = auVar184._0_4_ * auVar24._0_4_ * (2.0 - local_9c0._0_4_ * auVar24._0_4_);
  auVar24 = vshufps_avx(ZEXT416((uint)fVar331),ZEXT416((uint)fVar331),0);
  auVar179._0_4_ = auVar16._0_4_ + local_9b0._0_4_ * auVar24._0_4_;
  auVar179._4_4_ = auVar16._4_4_ + local_9b0._4_4_ * auVar24._4_4_;
  auVar179._8_4_ = auVar16._8_4_ + local_9b0._8_4_ * auVar24._8_4_;
  auVar179._12_4_ = auVar16._12_4_ + local_9b0._12_4_ * auVar24._12_4_;
  auVar184 = vblendps_avx(auVar179,_DAT_01f45a50,8);
  auVar25 = vsubps_avx(auVar129,auVar184);
  auVar26 = vsubps_avx(auVar130,auVar184);
  auVar27 = vsubps_avx(auVar209,auVar184);
  auVar28 = vsubps_avx(auVar160,auVar184);
  auVar184 = vshufps_avx(auVar25,auVar25,0);
  register0x00001250 = auVar184;
  _local_1e0 = auVar184;
  auVar184 = vshufps_avx(auVar25,auVar25,0x55);
  auVar144._16_16_ = auVar184;
  auVar144._0_16_ = auVar184;
  auVar16 = vshufps_avx(auVar25,auVar25,0xaa);
  local_360._16_16_ = auVar16;
  local_360._0_16_ = auVar16;
  auVar16 = vshufps_avx(auVar25,auVar25,0xff);
  auVar130 = vshufps_avx(auVar27,auVar27,0);
  auVar269._16_16_ = auVar130;
  auVar269._0_16_ = auVar130;
  auVar130 = vshufps_avx(auVar27,auVar27,0x55);
  local_940._16_16_ = auVar130;
  local_940._0_16_ = auVar130;
  auVar386 = ZEXT3264(local_940);
  auVar130 = vshufps_avx(auVar27,auVar27,0xaa);
  auVar302._16_16_ = auVar130;
  auVar302._0_16_ = auVar130;
  auVar130 = vshufps_avx(auVar27,auVar27,0xff);
  local_980._16_16_ = auVar130;
  local_980._0_16_ = auVar130;
  auVar130 = vshufps_avx(auVar26,auVar26,0);
  local_380._16_16_ = auVar130;
  local_380._0_16_ = auVar130;
  auVar130 = vshufps_avx(auVar26,auVar26,0x55);
  local_3a0._16_16_ = auVar130;
  local_3a0._0_16_ = auVar130;
  auVar130 = vshufps_avx(auVar26,auVar26,0xaa);
  register0x00001290 = auVar130;
  _local_200 = auVar130;
  auVar130 = vshufps_avx(auVar26,auVar26,0xff);
  register0x00001290 = auVar130;
  _local_220 = auVar130;
  auVar130 = vshufps_avx(auVar28,auVar28,0);
  register0x00001290 = auVar130;
  _local_240 = auVar130;
  auVar130 = vshufps_avx(auVar28,auVar28,0x55);
  register0x00001290 = auVar130;
  _local_260 = auVar130;
  auVar130 = vshufps_avx(auVar28,auVar28,0xaa);
  register0x00001290 = auVar130;
  _local_280 = auVar130;
  auVar130 = vshufps_avx(auVar28,auVar28,0xff);
  auVar275 = ZEXT3264(local_980);
  register0x00001290 = auVar130;
  _local_2a0 = auVar130;
  auVar130 = ZEXT416((uint)(fVar320 * fVar320 + fVar327 * fVar327 + fVar329 * fVar329));
  auVar130 = vshufps_avx(auVar130,auVar130,0);
  local_2c0._16_16_ = auVar130;
  local_2c0._0_16_ = auVar130;
  fVar320 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)fVar331);
  auVar130 = vshufps_avx(ZEXT416((uint)(fVar320 - fVar331)),ZEXT416((uint)(fVar320 - fVar331)),0);
  local_3c0._16_16_ = auVar130;
  local_3c0._0_16_ = auVar130;
  local_770 = vpshufd_avx(ZEXT416(uVar86),0);
  local_780 = vpshufd_avx(ZEXT416(*(uint *)(local_8c8 + lVar88 * 4 + 6)),0);
  register0x00001210 = auVar24;
  _local_8a0 = auVar24;
  uVar83 = 0;
  local_c48 = 1;
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  local_5a0 = vandps_avx(local_2c0,auVar109);
  auVar24 = vsqrtss_avx(local_9c0,local_9c0);
  auVar130 = vsqrtss_avx(local_9c0,local_9c0);
  local_a40._0_4_ = auVar184._0_4_;
  local_a40._4_4_ = auVar184._4_4_;
  fStack_a38 = auVar184._8_4_;
  fStack_a34 = auVar184._12_4_;
  local_5d0 = ZEXT816(0x3f80000000000000);
  local_580 = auVar269;
  fVar327 = (float)local_a40._0_4_;
  fVar329 = (float)local_a40._4_4_;
  fVar331 = fStack_a38;
  fVar172 = fStack_a34;
  fVar173 = (float)local_a40._0_4_;
  fVar174 = (float)local_a40._4_4_;
  fVar175 = fStack_a38;
  local_ac0 = auVar302;
  _local_a40 = auVar144;
  do {
    auVar243._8_4_ = 0x3f800000;
    auVar243._0_8_ = 0x3f8000003f800000;
    auVar243._12_4_ = 0x3f800000;
    auVar243._16_4_ = 0x3f800000;
    auVar243._20_4_ = 0x3f800000;
    auVar243._24_4_ = 0x3f800000;
    auVar243._28_4_ = 0x3f800000;
    auVar184 = vmovshdup_avx(local_5d0);
    auVar187 = vsubps_avx(auVar184,local_5d0);
    auVar184 = vshufps_avx(local_5d0,local_5d0,0);
    local_7c0._16_16_ = auVar184;
    local_7c0._0_16_ = auVar184;
    auVar265 = vshufps_avx(auVar187,auVar187,0);
    local_7e0._16_16_ = auVar265;
    local_7e0._0_16_ = auVar265;
    fVar128 = auVar265._0_4_;
    fVar155 = auVar265._4_4_;
    fVar156 = auVar265._8_4_;
    fVar157 = auVar265._12_4_;
    fVar389 = auVar184._0_4_;
    auVar145._0_4_ = fVar389 + fVar128 * 0.0;
    fVar119 = auVar184._4_4_;
    auVar145._4_4_ = fVar119 + fVar155 * 0.14285715;
    fVar121 = auVar184._8_4_;
    auVar145._8_4_ = fVar121 + fVar156 * 0.2857143;
    fVar123 = auVar184._12_4_;
    auVar145._12_4_ = fVar123 + fVar157 * 0.42857146;
    auVar145._16_4_ = fVar389 + fVar128 * 0.5714286;
    auVar145._20_4_ = fVar119 + fVar155 * 0.71428573;
    auVar145._24_4_ = fVar121 + fVar156 * 0.8571429;
    auVar145._28_4_ = fVar123 + fVar157;
    auVar108 = vsubps_avx(auVar243,auVar145);
    fVar259 = auVar108._0_4_;
    fVar276 = auVar108._4_4_;
    fVar280 = auVar108._8_4_;
    fVar284 = auVar108._12_4_;
    fVar307 = auVar108._16_4_;
    fVar313 = auVar108._20_4_;
    fVar314 = auVar108._24_4_;
    fVar204 = auVar269._28_4_ + auVar302._28_4_;
    fVar297 = auVar275._28_4_;
    fVar205 = fVar297 + fVar204 + 1.0;
    fVar260 = local_380._0_4_ * auVar145._0_4_ + auVar269._0_4_ * fVar259;
    fVar277 = local_380._4_4_ * auVar145._4_4_ + auVar269._4_4_ * fVar276;
    fVar281 = local_380._8_4_ * auVar145._8_4_ + auVar269._8_4_ * fVar280;
    fVar285 = local_380._12_4_ * auVar145._12_4_ + auVar269._12_4_ * fVar284;
    fVar288 = local_380._16_4_ * auVar145._16_4_ + auVar269._16_4_ * fVar307;
    fVar291 = local_380._20_4_ * auVar145._20_4_ + auVar269._20_4_ * fVar313;
    fVar294 = local_380._24_4_ * auVar145._24_4_ + auVar269._24_4_ * fVar314;
    fVar315 = local_3a0._0_4_ * auVar145._0_4_ + auVar386._0_4_ * fVar259;
    fVar198 = local_3a0._4_4_ * auVar145._4_4_ + auVar386._4_4_ * fVar276;
    fVar199 = local_3a0._8_4_ * auVar145._8_4_ + auVar386._8_4_ * fVar280;
    fVar200 = local_3a0._12_4_ * auVar145._12_4_ + auVar386._12_4_ * fVar284;
    fVar201 = local_3a0._16_4_ * auVar145._16_4_ + auVar386._16_4_ * fVar307;
    fVar202 = local_3a0._20_4_ * auVar145._20_4_ + auVar386._20_4_ * fVar313;
    fVar203 = local_3a0._24_4_ * auVar145._24_4_ + auVar386._24_4_ * fVar314;
    fVar206 = (float)local_200._0_4_ * auVar145._0_4_ + auVar302._0_4_ * fVar259;
    fVar228 = (float)local_200._4_4_ * auVar145._4_4_ + auVar302._4_4_ * fVar276;
    fVar229 = fStack_1f8 * auVar145._8_4_ + auVar302._8_4_ * fVar280;
    fVar230 = fStack_1f4 * auVar145._12_4_ + auVar302._12_4_ * fVar284;
    fVar231 = fStack_1f0 * auVar145._16_4_ + auVar302._16_4_ * fVar307;
    fVar232 = fStack_1ec * auVar145._20_4_ + auVar302._20_4_ * fVar313;
    fVar233 = fStack_1e8 * auVar145._24_4_ + auVar302._24_4_ * fVar314;
    fVar234 = (float)local_220._0_4_ * auVar145._0_4_ + auVar275._0_4_ * fVar259;
    fVar253 = (float)local_220._4_4_ * auVar145._4_4_ + auVar275._4_4_ * fVar276;
    fVar254 = fStack_218 * auVar145._8_4_ + auVar275._8_4_ * fVar280;
    fVar255 = fStack_214 * auVar145._12_4_ + auVar275._12_4_ * fVar284;
    fVar256 = fStack_210 * auVar145._16_4_ + auVar275._16_4_ * fVar307;
    fVar257 = fStack_20c * auVar145._20_4_ + auVar275._20_4_ * fVar313;
    fVar258 = fStack_208 * auVar145._24_4_ + auVar275._24_4_ * fVar314;
    fVar380 = fVar297 + local_380._28_4_;
    fVar362 = local_360._28_4_ + fVar297;
    auVar310._0_4_ =
         fVar259 * (auVar269._0_4_ * auVar145._0_4_ + fVar259 * (float)local_1e0._0_4_) +
         auVar145._0_4_ * fVar260;
    auVar310._4_4_ =
         fVar276 * (auVar269._4_4_ * auVar145._4_4_ + fVar276 * (float)local_1e0._4_4_) +
         auVar145._4_4_ * fVar277;
    auVar310._8_4_ =
         fVar280 * (auVar269._8_4_ * auVar145._8_4_ + fVar280 * fStack_1d8) +
         auVar145._8_4_ * fVar281;
    auVar310._12_4_ =
         fVar284 * (auVar269._12_4_ * auVar145._12_4_ + fVar284 * fStack_1d4) +
         auVar145._12_4_ * fVar285;
    auVar310._16_4_ =
         fVar307 * (auVar269._16_4_ * auVar145._16_4_ + fVar307 * fStack_1d0) +
         auVar145._16_4_ * fVar288;
    auVar310._20_4_ =
         fVar313 * (auVar269._20_4_ * auVar145._20_4_ + fVar313 * fStack_1cc) +
         auVar145._20_4_ * fVar291;
    auVar310._24_4_ =
         fVar314 * (auVar269._24_4_ * auVar145._24_4_ + fVar314 * fStack_1c8) +
         auVar145._24_4_ * fVar294;
    auVar310._28_4_ = fStack_1e4 + fVar297;
    auVar325._0_4_ =
         (auVar386._0_4_ * auVar145._0_4_ + fVar327 * fVar259) * fVar259 + auVar145._0_4_ * fVar315;
    auVar325._4_4_ =
         (auVar386._4_4_ * auVar145._4_4_ + fVar329 * fVar276) * fVar276 + auVar145._4_4_ * fVar198;
    auVar325._8_4_ =
         (auVar386._8_4_ * auVar145._8_4_ + fVar331 * fVar280) * fVar280 + auVar145._8_4_ * fVar199;
    auVar325._12_4_ =
         (auVar386._12_4_ * auVar145._12_4_ + fVar172 * fVar284) * fVar284 +
         auVar145._12_4_ * fVar200;
    auVar325._16_4_ =
         (auVar386._16_4_ * auVar145._16_4_ + fVar173 * fVar307) * fVar307 +
         auVar145._16_4_ * fVar201;
    auVar325._20_4_ =
         (auVar386._20_4_ * auVar145._20_4_ + fVar174 * fVar313) * fVar313 +
         auVar145._20_4_ * fVar202;
    auVar325._24_4_ =
         (auVar386._24_4_ * auVar145._24_4_ + fVar175 * fVar314) * fVar314 +
         auVar145._24_4_ * fVar203;
    auVar325._28_4_ = fVar204 + 1.0 + fVar297;
    auVar340._0_4_ =
         fVar259 * (auVar302._0_4_ * auVar145._0_4_ + local_360._0_4_ * fVar259) +
         auVar145._0_4_ * fVar206;
    auVar340._4_4_ =
         fVar276 * (auVar302._4_4_ * auVar145._4_4_ + local_360._4_4_ * fVar276) +
         auVar145._4_4_ * fVar228;
    auVar340._8_4_ =
         fVar280 * (auVar302._8_4_ * auVar145._8_4_ + local_360._8_4_ * fVar280) +
         auVar145._8_4_ * fVar229;
    auVar340._12_4_ =
         fVar284 * (auVar302._12_4_ * auVar145._12_4_ + local_360._12_4_ * fVar284) +
         auVar145._12_4_ * fVar230;
    auVar340._16_4_ =
         fVar307 * (auVar302._16_4_ * auVar145._16_4_ + local_360._16_4_ * fVar307) +
         auVar145._16_4_ * fVar231;
    auVar340._20_4_ =
         fVar313 * (auVar302._20_4_ * auVar145._20_4_ + local_360._20_4_ * fVar313) +
         auVar145._20_4_ * fVar232;
    auVar340._24_4_ =
         fVar314 * (auVar302._24_4_ * auVar145._24_4_ + local_360._24_4_ * fVar314) +
         auVar145._24_4_ * fVar233;
    auVar340._28_4_ = fStack_204 + fVar297;
    auVar303._0_4_ =
         auVar145._0_4_ * fVar234 +
         fVar259 * (auVar275._0_4_ * auVar145._0_4_ + auVar16._0_4_ * fVar259);
    auVar303._4_4_ =
         auVar145._4_4_ * fVar253 +
         fVar276 * (auVar275._4_4_ * auVar145._4_4_ + auVar16._4_4_ * fVar276);
    auVar303._8_4_ =
         auVar145._8_4_ * fVar254 +
         fVar280 * (auVar275._8_4_ * auVar145._8_4_ + auVar16._8_4_ * fVar280);
    auVar303._12_4_ =
         auVar145._12_4_ * fVar255 +
         fVar284 * (auVar275._12_4_ * auVar145._12_4_ + auVar16._12_4_ * fVar284);
    auVar303._16_4_ =
         auVar145._16_4_ * fVar256 +
         fVar307 * (auVar275._16_4_ * auVar145._16_4_ + auVar16._0_4_ * fVar307);
    auVar303._20_4_ =
         auVar145._20_4_ * fVar257 +
         fVar313 * (auVar275._20_4_ * auVar145._20_4_ + auVar16._4_4_ * fVar313);
    auVar303._24_4_ =
         auVar145._24_4_ * fVar258 +
         fVar314 * (auVar275._24_4_ * auVar145._24_4_ + auVar16._8_4_ * fVar314);
    auVar303._28_4_ = fStack_204 + local_3a0._28_4_;
    auVar110._0_4_ =
         (auVar145._0_4_ * (float)local_240._0_4_ + local_380._0_4_ * fVar259) * auVar145._0_4_ +
         fVar259 * fVar260;
    auVar110._4_4_ =
         (auVar145._4_4_ * (float)local_240._4_4_ + local_380._4_4_ * fVar276) * auVar145._4_4_ +
         fVar276 * fVar277;
    auVar110._8_4_ =
         (auVar145._8_4_ * fStack_238 + local_380._8_4_ * fVar280) * auVar145._8_4_ +
         fVar280 * fVar281;
    auVar110._12_4_ =
         (auVar145._12_4_ * fStack_234 + local_380._12_4_ * fVar284) * auVar145._12_4_ +
         fVar284 * fVar285;
    auVar110._16_4_ =
         (auVar145._16_4_ * fStack_230 + local_380._16_4_ * fVar307) * auVar145._16_4_ +
         fVar307 * fVar288;
    auVar110._20_4_ =
         (auVar145._20_4_ * fStack_22c + local_380._20_4_ * fVar313) * auVar145._20_4_ +
         fVar313 * fVar291;
    auVar110._24_4_ =
         (auVar145._24_4_ * fStack_228 + local_380._24_4_ * fVar314) * auVar145._24_4_ +
         fVar314 * fVar294;
    auVar110._28_4_ = fStack_204 + fVar205 + fVar297;
    auVar194._0_4_ =
         (auVar145._0_4_ * (float)local_260._0_4_ + local_3a0._0_4_ * fVar259) * auVar145._0_4_ +
         fVar259 * fVar315;
    auVar194._4_4_ =
         (auVar145._4_4_ * (float)local_260._4_4_ + local_3a0._4_4_ * fVar276) * auVar145._4_4_ +
         fVar276 * fVar198;
    auVar194._8_4_ =
         (auVar145._8_4_ * fStack_258 + local_3a0._8_4_ * fVar280) * auVar145._8_4_ +
         fVar280 * fVar199;
    auVar194._12_4_ =
         (auVar145._12_4_ * fStack_254 + local_3a0._12_4_ * fVar284) * auVar145._12_4_ +
         fVar284 * fVar200;
    auVar194._16_4_ =
         (auVar145._16_4_ * fStack_250 + local_3a0._16_4_ * fVar307) * auVar145._16_4_ +
         fVar307 * fVar201;
    auVar194._20_4_ =
         (auVar145._20_4_ * fStack_24c + local_3a0._20_4_ * fVar313) * auVar145._20_4_ +
         fVar313 * fVar202;
    auVar194._24_4_ =
         (auVar145._24_4_ * fStack_248 + local_3a0._24_4_ * fVar314) * auVar145._24_4_ +
         fVar314 * fVar203;
    auVar194._28_4_ = fStack_204 + fVar205 + 1.0;
    auVar219._0_4_ =
         (auVar145._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar259) *
         auVar145._0_4_ + fVar259 * fVar206;
    auVar219._4_4_ =
         (auVar145._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar276) *
         auVar145._4_4_ + fVar276 * fVar228;
    auVar219._8_4_ =
         (auVar145._8_4_ * fStack_278 + fStack_1f8 * fVar280) * auVar145._8_4_ + fVar280 * fVar229;
    auVar219._12_4_ =
         (auVar145._12_4_ * fStack_274 + fStack_1f4 * fVar284) * auVar145._12_4_ + fVar284 * fVar230
    ;
    auVar219._16_4_ =
         (auVar145._16_4_ * fStack_270 + fStack_1f0 * fVar307) * auVar145._16_4_ + fVar307 * fVar231
    ;
    auVar219._20_4_ =
         (auVar145._20_4_ * fStack_26c + fStack_1ec * fVar313) * auVar145._20_4_ + fVar313 * fVar232
    ;
    auVar219._24_4_ =
         (auVar145._24_4_ * fStack_268 + fStack_1e8 * fVar314) * auVar145._24_4_ + fVar314 * fVar233
    ;
    auVar219._28_4_ = fVar362 + 2.0;
    auVar244._0_4_ =
         (auVar145._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar259) *
         auVar145._0_4_ + fVar259 * fVar234;
    auVar244._4_4_ =
         (auVar145._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar276) *
         auVar145._4_4_ + fVar276 * fVar253;
    auVar244._8_4_ =
         (auVar145._8_4_ * fStack_298 + fStack_218 * fVar280) * auVar145._8_4_ + fVar280 * fVar254;
    auVar244._12_4_ =
         (auVar145._12_4_ * fStack_294 + fStack_214 * fVar284) * auVar145._12_4_ + fVar284 * fVar255
    ;
    auVar244._16_4_ =
         (auVar145._16_4_ * fStack_290 + fStack_210 * fVar307) * auVar145._16_4_ + fVar307 * fVar256
    ;
    auVar244._20_4_ =
         (auVar145._20_4_ * fStack_28c + fStack_20c * fVar313) * auVar145._20_4_ + fVar313 * fVar257
    ;
    auVar244._24_4_ =
         (auVar145._24_4_ * fStack_288 + fStack_208 * fVar314) * auVar145._24_4_ + fVar314 * fVar258
    ;
    auVar244._28_4_ = fVar380 + local_360._28_4_ + 1.0;
    fVar261 = auVar310._0_4_ * fVar259 + auVar145._0_4_ * auVar110._0_4_;
    fVar278 = auVar310._4_4_ * fVar276 + auVar145._4_4_ * auVar110._4_4_;
    fVar282 = auVar310._8_4_ * fVar280 + auVar145._8_4_ * auVar110._8_4_;
    fVar286 = auVar310._12_4_ * fVar284 + auVar145._12_4_ * auVar110._12_4_;
    fVar289 = auVar310._16_4_ * fVar307 + auVar145._16_4_ * auVar110._16_4_;
    fVar292 = auVar310._20_4_ * fVar313 + auVar145._20_4_ * auVar110._20_4_;
    fVar295 = auVar310._24_4_ * fVar314 + auVar145._24_4_ * auVar110._24_4_;
    fVar298 = fVar380 + fStack_204;
    local_a00._0_4_ = auVar325._0_4_ * fVar259 + auVar145._0_4_ * auVar194._0_4_;
    local_a00._4_4_ = auVar325._4_4_ * fVar276 + auVar145._4_4_ * auVar194._4_4_;
    local_a00._8_4_ = auVar325._8_4_ * fVar280 + auVar145._8_4_ * auVar194._8_4_;
    local_a00._12_4_ = auVar325._12_4_ * fVar284 + auVar145._12_4_ * auVar194._12_4_;
    local_a00._16_4_ = auVar325._16_4_ * fVar307 + auVar145._16_4_ * auVar194._16_4_;
    local_a00._20_4_ = auVar325._20_4_ * fVar313 + auVar145._20_4_ * auVar194._20_4_;
    local_a00._24_4_ = auVar325._24_4_ * fVar314 + auVar145._24_4_ * auVar194._24_4_;
    local_a00._28_4_ = fStack_204 + fVar362;
    local_2e0._0_4_ = auVar340._0_4_ * fVar259 + auVar145._0_4_ * auVar219._0_4_;
    local_2e0._4_4_ = auVar340._4_4_ * fVar276 + auVar145._4_4_ * auVar219._4_4_;
    local_2e0._8_4_ = auVar340._8_4_ * fVar280 + auVar145._8_4_ * auVar219._8_4_;
    local_2e0._12_4_ = auVar340._12_4_ * fVar284 + auVar145._12_4_ * auVar219._12_4_;
    local_2e0._16_4_ = auVar340._16_4_ * fVar307 + auVar145._16_4_ * auVar219._16_4_;
    local_2e0._20_4_ = auVar340._20_4_ * fVar313 + auVar145._20_4_ * auVar219._20_4_;
    local_2e0._24_4_ = auVar340._24_4_ * fVar314 + auVar145._24_4_ * auVar219._24_4_;
    local_2e0._28_4_ = fVar362 + fStack_204;
    local_c20._0_4_ = auVar187._0_4_;
    auVar270._0_4_ = fVar259 * auVar303._0_4_ + auVar145._0_4_ * auVar244._0_4_;
    auVar270._4_4_ = fVar276 * auVar303._4_4_ + auVar145._4_4_ * auVar244._4_4_;
    auVar270._8_4_ = fVar280 * auVar303._8_4_ + auVar145._8_4_ * auVar244._8_4_;
    auVar270._12_4_ = fVar284 * auVar303._12_4_ + auVar145._12_4_ * auVar244._12_4_;
    auVar270._16_4_ = fVar307 * auVar303._16_4_ + auVar145._16_4_ * auVar244._16_4_;
    auVar270._20_4_ = fVar313 * auVar303._20_4_ + auVar145._20_4_ * auVar244._20_4_;
    auVar270._24_4_ = fVar314 * auVar303._24_4_ + auVar145._24_4_ * auVar244._24_4_;
    auVar270._28_4_ = auVar108._28_4_ + auVar145._28_4_;
    auVar108 = vsubps_avx(auVar110,auVar310);
    auVar109 = vsubps_avx(auVar194,auVar325);
    auVar269 = vsubps_avx(auVar219,auVar340);
    auVar144 = vsubps_avx(auVar244,auVar303);
    auVar184 = vshufps_avx(ZEXT416((uint)((float)local_c20._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_c20._0_4_ * 0.04761905)),0);
    fVar175 = auVar184._0_4_;
    fVar350 = fVar175 * auVar108._0_4_ * 3.0;
    fVar307 = auVar184._4_4_;
    fVar356 = fVar307 * auVar108._4_4_ * 3.0;
    local_960._4_4_ = fVar356;
    local_960._0_4_ = fVar350;
    fVar313 = auVar184._8_4_;
    fVar357 = fVar313 * auVar108._8_4_ * 3.0;
    local_960._8_4_ = fVar357;
    fVar174 = auVar184._12_4_;
    fVar358 = fVar174 * auVar108._12_4_ * 3.0;
    local_960._12_4_ = fVar358;
    fVar359 = fVar175 * auVar108._16_4_ * 3.0;
    local_960._16_4_ = fVar359;
    fVar360 = fVar307 * auVar108._20_4_ * 3.0;
    local_960._20_4_ = fVar360;
    fVar361 = fVar313 * auVar108._24_4_ * 3.0;
    local_960._24_4_ = fVar361;
    local_960._28_4_ = fVar362;
    fVar336 = fVar175 * auVar109._0_4_ * 3.0;
    fVar344 = fVar307 * auVar109._4_4_ * 3.0;
    auVar33._4_4_ = fVar344;
    auVar33._0_4_ = fVar336;
    fVar345 = fVar313 * auVar109._8_4_ * 3.0;
    auVar33._8_4_ = fVar345;
    fVar346 = fVar174 * auVar109._12_4_ * 3.0;
    auVar33._12_4_ = fVar346;
    fVar347 = fVar175 * auVar109._16_4_ * 3.0;
    auVar33._16_4_ = fVar347;
    fVar348 = fVar307 * auVar109._20_4_ * 3.0;
    auVar33._20_4_ = fVar348;
    fVar349 = fVar313 * auVar109._24_4_ * 3.0;
    auVar33._24_4_ = fVar349;
    auVar33._28_4_ = auVar340._28_4_;
    fVar363 = fVar175 * auVar269._0_4_ * 3.0;
    fVar368 = fVar307 * auVar269._4_4_ * 3.0;
    auVar35._4_4_ = fVar368;
    auVar35._0_4_ = fVar363;
    fVar370 = fVar313 * auVar269._8_4_ * 3.0;
    auVar35._8_4_ = fVar370;
    fVar372 = fVar174 * auVar269._12_4_ * 3.0;
    auVar35._12_4_ = fVar372;
    fVar374 = fVar175 * auVar269._16_4_ * 3.0;
    auVar35._16_4_ = fVar374;
    fVar376 = fVar307 * auVar269._20_4_ * 3.0;
    auVar35._20_4_ = fVar376;
    fVar378 = fVar313 * auVar269._24_4_ * 3.0;
    auVar35._24_4_ = fVar378;
    auVar35._28_4_ = fVar380;
    fVar331 = fVar175 * auVar144._0_4_ * 3.0;
    fVar172 = fVar307 * auVar144._4_4_ * 3.0;
    auVar29._4_4_ = fVar172;
    auVar29._0_4_ = fVar331;
    fVar173 = fVar313 * auVar144._8_4_ * 3.0;
    auVar29._8_4_ = fVar173;
    fVar174 = fVar174 * auVar144._12_4_ * 3.0;
    auVar29._12_4_ = fVar174;
    fVar175 = fVar175 * auVar144._16_4_ * 3.0;
    auVar29._16_4_ = fVar175;
    fVar307 = fVar307 * auVar144._20_4_ * 3.0;
    auVar29._20_4_ = fVar307;
    fVar313 = fVar313 * auVar144._24_4_ * 3.0;
    auVar29._24_4_ = fVar313;
    auVar29._28_4_ = auVar109._28_4_;
    auVar108 = vperm2f128_avx(local_a00,local_a00,1);
    auVar108 = vshufps_avx(auVar108,local_a00,0x30);
    auVar144 = vshufps_avx(local_a00,auVar108,0x29);
    auVar108 = vperm2f128_avx(local_2e0,local_2e0,1);
    auVar108 = vshufps_avx(auVar108,local_2e0,0x30);
    auVar302 = vshufps_avx(local_2e0,auVar108,0x29);
    auVar269 = vsubps_avx(auVar270,auVar29);
    auVar108 = vperm2f128_avx(auVar269,auVar269,1);
    auVar108 = vshufps_avx(auVar108,auVar269,0x30);
    auVar29 = vshufps_avx(auVar269,auVar108,0x29);
    local_6c0 = vsubps_avx(auVar144,local_a00);
    local_300 = vsubps_avx(auVar302,local_2e0);
    fVar259 = local_6c0._0_4_;
    fVar314 = local_6c0._4_4_;
    auVar30._4_4_ = fVar368 * fVar314;
    auVar30._0_4_ = fVar363 * fVar259;
    fVar202 = local_6c0._8_4_;
    auVar30._8_4_ = fVar370 * fVar202;
    fVar229 = local_6c0._12_4_;
    auVar30._12_4_ = fVar372 * fVar229;
    fVar253 = local_6c0._16_4_;
    auVar30._16_4_ = fVar374 * fVar253;
    fVar260 = local_6c0._20_4_;
    auVar30._20_4_ = fVar376 * fVar260;
    fVar294 = local_6c0._24_4_;
    auVar30._24_4_ = fVar378 * fVar294;
    auVar30._28_4_ = auVar269._28_4_;
    fVar276 = local_300._0_4_;
    fVar315 = local_300._4_4_;
    auVar31._4_4_ = fVar344 * fVar315;
    auVar31._0_4_ = fVar336 * fVar276;
    fVar203 = local_300._8_4_;
    auVar31._8_4_ = fVar345 * fVar203;
    fVar230 = local_300._12_4_;
    auVar31._12_4_ = fVar346 * fVar230;
    fVar254 = local_300._16_4_;
    auVar31._16_4_ = fVar347 * fVar254;
    fVar277 = local_300._20_4_;
    auVar31._20_4_ = fVar348 * fVar277;
    fVar297 = local_300._24_4_;
    auVar31._24_4_ = fVar349 * fVar297;
    auVar31._28_4_ = auVar108._28_4_;
    auVar31 = vsubps_avx(auVar31,auVar30);
    auVar76._4_4_ = fVar278;
    auVar76._0_4_ = fVar261;
    auVar76._8_4_ = fVar282;
    auVar76._12_4_ = fVar286;
    auVar76._16_4_ = fVar289;
    auVar76._20_4_ = fVar292;
    auVar76._24_4_ = fVar295;
    auVar76._28_4_ = fVar298;
    auVar108 = vperm2f128_avx(auVar76,auVar76,1);
    auVar108 = vshufps_avx(auVar108,auVar76,0x30);
    auVar30 = vshufps_avx(auVar76,auVar108,0x29);
    local_520 = vsubps_avx(auVar30,auVar76);
    auVar220._4_4_ = fVar356 * fVar315;
    auVar220._0_4_ = fVar350 * fVar276;
    auVar220._8_4_ = fVar357 * fVar203;
    auVar220._12_4_ = fVar358 * fVar230;
    auVar220._16_4_ = fVar359 * fVar254;
    auVar220._20_4_ = fVar360 * fVar277;
    auVar220._24_4_ = fVar361 * fVar297;
    auVar220._28_4_ = auVar30._28_4_;
    fVar280 = local_520._0_4_;
    fVar198 = local_520._4_4_;
    auVar32._4_4_ = fVar368 * fVar198;
    auVar32._0_4_ = fVar363 * fVar280;
    fVar204 = local_520._8_4_;
    auVar32._8_4_ = fVar370 * fVar204;
    fVar231 = local_520._12_4_;
    auVar32._12_4_ = fVar372 * fVar231;
    fVar255 = local_520._16_4_;
    auVar32._16_4_ = fVar374 * fVar255;
    fVar281 = local_520._20_4_;
    auVar32._20_4_ = fVar376 * fVar281;
    fVar22 = local_520._24_4_;
    auVar32._24_4_ = fVar378 * fVar22;
    auVar32._28_4_ = auVar310._28_4_;
    auVar220 = vsubps_avx(auVar32,auVar220);
    auVar221._4_4_ = fVar344 * fVar198;
    auVar221._0_4_ = fVar336 * fVar280;
    auVar221._8_4_ = fVar345 * fVar204;
    auVar221._12_4_ = fVar346 * fVar231;
    auVar221._16_4_ = fVar347 * fVar255;
    auVar221._20_4_ = fVar348 * fVar281;
    auVar221._24_4_ = fVar349 * fVar22;
    auVar221._28_4_ = auVar310._28_4_;
    auVar34._4_4_ = fVar356 * fVar314;
    auVar34._0_4_ = fVar350 * fVar259;
    auVar34._8_4_ = fVar357 * fVar202;
    auVar34._12_4_ = fVar358 * fVar229;
    auVar34._16_4_ = fVar359 * fVar253;
    auVar34._20_4_ = fVar360 * fVar260;
    auVar34._24_4_ = fVar361 * fVar294;
    auVar34._28_4_ = auVar325._28_4_;
    auVar32 = vsubps_avx(auVar34,auVar221);
    fVar327 = auVar32._28_4_;
    auVar195._0_4_ = fVar280 * fVar280 + fVar259 * fVar259 + fVar276 * fVar276;
    auVar195._4_4_ = fVar198 * fVar198 + fVar314 * fVar314 + fVar315 * fVar315;
    auVar195._8_4_ = fVar204 * fVar204 + fVar202 * fVar202 + fVar203 * fVar203;
    auVar195._12_4_ = fVar231 * fVar231 + fVar229 * fVar229 + fVar230 * fVar230;
    auVar195._16_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar254 * fVar254;
    auVar195._20_4_ = fVar281 * fVar281 + fVar260 * fVar260 + fVar277 * fVar277;
    auVar195._24_4_ = fVar22 * fVar22 + fVar294 * fVar294 + fVar297 * fVar297;
    auVar195._28_4_ = fVar327 + fVar327 + auVar31._28_4_;
    auVar108 = vrcpps_avx(auVar195);
    fVar200 = auVar108._0_4_;
    fVar201 = auVar108._4_4_;
    auVar36._4_4_ = fVar201 * auVar195._4_4_;
    auVar36._0_4_ = fVar200 * auVar195._0_4_;
    fVar206 = auVar108._8_4_;
    auVar36._8_4_ = fVar206 * auVar195._8_4_;
    fVar228 = auVar108._12_4_;
    auVar36._12_4_ = fVar228 * auVar195._12_4_;
    fVar233 = auVar108._16_4_;
    auVar36._16_4_ = fVar233 * auVar195._16_4_;
    fVar234 = auVar108._20_4_;
    auVar36._20_4_ = fVar234 * auVar195._20_4_;
    fVar257 = auVar108._24_4_;
    auVar36._24_4_ = fVar257 * auVar195._24_4_;
    auVar36._28_4_ = auVar325._28_4_;
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = 0x3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar111._16_4_ = 0x3f800000;
    auVar111._20_4_ = 0x3f800000;
    auVar111._24_4_ = 0x3f800000;
    auVar111._28_4_ = 0x3f800000;
    auVar221 = vsubps_avx(auVar111,auVar36);
    fVar200 = fVar200 + fVar200 * auVar221._0_4_;
    fVar201 = fVar201 + fVar201 * auVar221._4_4_;
    fVar206 = fVar206 + fVar206 * auVar221._8_4_;
    fVar228 = fVar228 + fVar228 * auVar221._12_4_;
    fVar233 = fVar233 + fVar233 * auVar221._16_4_;
    fVar234 = fVar234 + fVar234 * auVar221._20_4_;
    fVar257 = fVar257 + fVar257 * auVar221._24_4_;
    auVar269 = vperm2f128_avx(auVar33,auVar33,1);
    auVar269 = vshufps_avx(auVar269,auVar33,0x30);
    local_aa0 = vshufps_avx(auVar33,auVar269,0x29);
    auVar269 = vperm2f128_avx(auVar35,auVar35,1);
    auVar269 = vshufps_avx(auVar269,auVar35,0x30);
    local_9e0 = vshufps_avx(auVar35,auVar269,0x29);
    fVar92 = local_9e0._0_4_;
    fVar120 = local_9e0._4_4_;
    auVar37._4_4_ = fVar120 * fVar314;
    auVar37._0_4_ = fVar92 * fVar259;
    fVar122 = local_9e0._8_4_;
    auVar37._8_4_ = fVar122 * fVar202;
    fVar124 = local_9e0._12_4_;
    auVar37._12_4_ = fVar124 * fVar229;
    fVar125 = local_9e0._16_4_;
    auVar37._16_4_ = fVar125 * fVar253;
    fVar126 = local_9e0._20_4_;
    auVar37._20_4_ = fVar126 * fVar260;
    fVar127 = local_9e0._24_4_;
    auVar37._24_4_ = fVar127 * fVar294;
    auVar37._28_4_ = auVar269._28_4_;
    fVar284 = local_aa0._0_4_;
    fVar199 = local_aa0._4_4_;
    auVar38._4_4_ = fVar315 * fVar199;
    auVar38._0_4_ = fVar276 * fVar284;
    fVar205 = local_aa0._8_4_;
    auVar38._8_4_ = fVar203 * fVar205;
    fVar232 = local_aa0._12_4_;
    auVar38._12_4_ = fVar230 * fVar232;
    fVar256 = local_aa0._16_4_;
    auVar38._16_4_ = fVar254 * fVar256;
    fVar285 = local_aa0._20_4_;
    auVar38._20_4_ = fVar277 * fVar285;
    fVar387 = local_aa0._24_4_;
    auVar38._24_4_ = fVar297 * fVar387;
    auVar38._28_4_ = auVar340._28_4_;
    auVar33 = vsubps_avx(auVar38,auVar37);
    auVar269 = vperm2f128_avx(local_960,local_960,1);
    auVar269 = vshufps_avx(auVar269,local_960,0x30);
    local_920 = vshufps_avx(local_960,auVar269,0x29);
    fVar364 = local_920._0_4_;
    fVar369 = local_920._4_4_;
    auVar39._4_4_ = fVar369 * fVar315;
    auVar39._0_4_ = fVar364 * fVar276;
    fVar371 = local_920._8_4_;
    auVar39._8_4_ = fVar371 * fVar203;
    fVar373 = local_920._12_4_;
    auVar39._12_4_ = fVar373 * fVar230;
    fVar375 = local_920._16_4_;
    auVar39._16_4_ = fVar375 * fVar254;
    fVar377 = local_920._20_4_;
    auVar39._20_4_ = fVar377 * fVar277;
    fVar379 = local_920._24_4_;
    auVar39._24_4_ = fVar379 * fVar297;
    auVar39._28_4_ = auVar269._28_4_;
    auVar40._4_4_ = fVar198 * fVar120;
    auVar40._0_4_ = fVar280 * fVar92;
    auVar40._8_4_ = fVar204 * fVar122;
    auVar40._12_4_ = fVar231 * fVar124;
    auVar40._16_4_ = fVar255 * fVar125;
    auVar40._20_4_ = fVar281 * fVar126;
    auVar40._24_4_ = fVar22 * fVar127;
    auVar40._28_4_ = fVar362;
    auVar269 = vsubps_avx(auVar40,auVar39);
    auVar41._4_4_ = fVar198 * fVar199;
    auVar41._0_4_ = fVar280 * fVar284;
    auVar41._8_4_ = fVar204 * fVar205;
    auVar41._12_4_ = fVar231 * fVar232;
    auVar41._16_4_ = fVar255 * fVar256;
    auVar41._20_4_ = fVar281 * fVar285;
    auVar41._24_4_ = fVar22 * fVar387;
    auVar41._28_4_ = fVar362;
    auVar42._4_4_ = fVar369 * fVar314;
    auVar42._0_4_ = fVar364 * fVar259;
    auVar42._8_4_ = fVar371 * fVar202;
    auVar42._12_4_ = fVar373 * fVar229;
    auVar42._16_4_ = fVar375 * fVar253;
    auVar42._20_4_ = fVar377 * fVar260;
    fVar329 = local_920._28_4_;
    auVar42._24_4_ = fVar379 * fVar294;
    auVar42._28_4_ = fVar329;
    auVar34 = vsubps_avx(auVar42,auVar41);
    auVar43._4_4_ =
         fVar201 * (auVar31._4_4_ * auVar31._4_4_ +
                   auVar32._4_4_ * auVar32._4_4_ + auVar220._4_4_ * auVar220._4_4_);
    auVar43._0_4_ =
         fVar200 * (auVar31._0_4_ * auVar31._0_4_ +
                   auVar32._0_4_ * auVar32._0_4_ + auVar220._0_4_ * auVar220._0_4_);
    auVar43._8_4_ =
         fVar206 * (auVar31._8_4_ * auVar31._8_4_ +
                   auVar32._8_4_ * auVar32._8_4_ + auVar220._8_4_ * auVar220._8_4_);
    auVar43._12_4_ =
         fVar228 * (auVar31._12_4_ * auVar31._12_4_ +
                   auVar32._12_4_ * auVar32._12_4_ + auVar220._12_4_ * auVar220._12_4_);
    auVar43._16_4_ =
         fVar233 * (auVar31._16_4_ * auVar31._16_4_ +
                   auVar32._16_4_ * auVar32._16_4_ + auVar220._16_4_ * auVar220._16_4_);
    auVar43._20_4_ =
         fVar234 * (auVar31._20_4_ * auVar31._20_4_ +
                   auVar32._20_4_ * auVar32._20_4_ + auVar220._20_4_ * auVar220._20_4_);
    auVar43._24_4_ =
         fVar257 * (auVar31._24_4_ * auVar31._24_4_ +
                   auVar32._24_4_ * auVar32._24_4_ + auVar220._24_4_ * auVar220._24_4_);
    auVar43._28_4_ = auVar31._28_4_ + fVar327 + auVar220._28_4_;
    auVar44._4_4_ =
         (auVar33._4_4_ * auVar33._4_4_ +
         auVar269._4_4_ * auVar269._4_4_ + auVar34._4_4_ * auVar34._4_4_) * fVar201;
    auVar44._0_4_ =
         (auVar33._0_4_ * auVar33._0_4_ +
         auVar269._0_4_ * auVar269._0_4_ + auVar34._0_4_ * auVar34._0_4_) * fVar200;
    auVar44._8_4_ =
         (auVar33._8_4_ * auVar33._8_4_ +
         auVar269._8_4_ * auVar269._8_4_ + auVar34._8_4_ * auVar34._8_4_) * fVar206;
    auVar44._12_4_ =
         (auVar33._12_4_ * auVar33._12_4_ +
         auVar269._12_4_ * auVar269._12_4_ + auVar34._12_4_ * auVar34._12_4_) * fVar228;
    auVar44._16_4_ =
         (auVar33._16_4_ * auVar33._16_4_ +
         auVar269._16_4_ * auVar269._16_4_ + auVar34._16_4_ * auVar34._16_4_) * fVar233;
    auVar44._20_4_ =
         (auVar33._20_4_ * auVar33._20_4_ +
         auVar269._20_4_ * auVar269._20_4_ + auVar34._20_4_ * auVar34._20_4_) * fVar234;
    auVar44._24_4_ =
         (auVar33._24_4_ * auVar33._24_4_ +
         auVar269._24_4_ * auVar269._24_4_ + auVar34._24_4_ * auVar34._24_4_) * fVar257;
    auVar44._28_4_ = auVar108._28_4_ + auVar221._28_4_;
    auVar108 = vmaxps_avx(auVar43,auVar44);
    auVar269 = vperm2f128_avx(auVar270,auVar270,1);
    auVar269 = vshufps_avx(auVar269,auVar270,0x30);
    auVar31 = vshufps_avx(auVar270,auVar269,0x29);
    local_600._0_4_ = auVar270._0_4_ + fVar331;
    local_600._4_4_ = auVar270._4_4_ + fVar172;
    local_600._8_4_ = auVar270._8_4_ + fVar173;
    local_600._12_4_ = auVar270._12_4_ + fVar174;
    local_600._16_4_ = auVar270._16_4_ + fVar175;
    local_600._20_4_ = auVar270._20_4_ + fVar307;
    local_600._24_4_ = auVar270._24_4_ + fVar313;
    local_600._28_4_ = auVar270._28_4_ + auVar109._28_4_;
    auVar269 = vmaxps_avx(auVar270,local_600);
    auVar109 = vmaxps_avx(auVar29,auVar31);
    auVar269 = vmaxps_avx(auVar269,auVar109);
    auVar109 = vrsqrtps_avx(auVar195);
    fVar327 = auVar109._0_4_;
    fVar331 = auVar109._4_4_;
    fVar172 = auVar109._8_4_;
    fVar173 = auVar109._12_4_;
    fVar174 = auVar109._16_4_;
    fVar175 = auVar109._20_4_;
    fVar307 = auVar109._24_4_;
    local_5c0 = fVar327 * 1.5 + fVar327 * fVar327 * fVar327 * auVar195._0_4_ * -0.5;
    fStack_5bc = fVar331 * 1.5 + fVar331 * fVar331 * fVar331 * auVar195._4_4_ * -0.5;
    fStack_5b8 = fVar172 * 1.5 + fVar172 * fVar172 * fVar172 * auVar195._8_4_ * -0.5;
    fStack_5b4 = fVar173 * 1.5 + fVar173 * fVar173 * fVar173 * auVar195._12_4_ * -0.5;
    fStack_5b0 = fVar174 * 1.5 + fVar174 * fVar174 * fVar174 * auVar195._16_4_ * -0.5;
    fStack_5ac = fVar175 * 1.5 + fVar175 * fVar175 * fVar175 * auVar195._20_4_ * -0.5;
    fStack_5a8 = fVar307 * 1.5 + fVar307 * fVar307 * fVar307 * auVar195._24_4_ * -0.5;
    auVar220 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_7a0 = vsubps_avx(auVar220,local_a00);
    auVar220 = vsubps_avx(auVar220,local_2e0);
    fVar321 = auVar220._0_4_;
    fVar328 = auVar220._4_4_;
    fVar330 = auVar220._8_4_;
    fVar332 = auVar220._12_4_;
    fVar333 = auVar220._16_4_;
    fVar334 = auVar220._20_4_;
    fVar335 = auVar220._24_4_;
    fVar307 = local_7a0._0_4_;
    fVar200 = local_7a0._4_4_;
    fVar206 = local_7a0._8_4_;
    fVar233 = local_7a0._12_4_;
    fVar257 = local_7a0._16_4_;
    fVar288 = local_7a0._20_4_;
    fVar362 = local_7a0._24_4_;
    auVar77._4_4_ = fVar278;
    auVar77._0_4_ = fVar261;
    auVar77._8_4_ = fVar282;
    auVar77._12_4_ = fVar286;
    auVar77._16_4_ = fVar289;
    auVar77._20_4_ = fVar292;
    auVar77._24_4_ = fVar295;
    auVar77._28_4_ = fVar298;
    auVar221 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar220 = vsubps_avx(auVar221,auVar77);
    fVar313 = auVar220._0_4_;
    fVar201 = auVar220._4_4_;
    fVar228 = auVar220._8_4_;
    fVar234 = auVar220._12_4_;
    fVar258 = auVar220._16_4_;
    fVar291 = auVar220._20_4_;
    fVar388 = auVar220._24_4_;
    auVar353._0_4_ =
         (float)local_a20._0_4_ * fVar313 +
         (float)local_680._0_4_ * fVar307 + fVar321 * (float)local_880._0_4_;
    auVar353._4_4_ =
         (float)local_a20._4_4_ * fVar201 +
         (float)local_680._4_4_ * fVar200 + fVar328 * (float)local_880._4_4_;
    auVar353._8_4_ = fStack_a18 * fVar228 + fStack_678 * fVar206 + fVar330 * fStack_878;
    auVar353._12_4_ = fStack_a14 * fVar234 + fStack_674 * fVar233 + fVar332 * fStack_874;
    auVar353._16_4_ = fStack_a10 * fVar258 + fStack_670 * fVar257 + fVar333 * fStack_870;
    auVar353._20_4_ = fStack_a0c * fVar291 + fStack_66c * fVar288 + fVar334 * fStack_86c;
    auVar353._24_4_ = fStack_a08 * fVar388 + fStack_668 * fVar362 + fVar335 * fStack_868;
    auVar353._28_4_ = fVar329 + auVar34._28_4_ + auVar195._28_4_;
    auVar366._0_4_ = fVar313 * fVar313 + fVar307 * fVar307 + fVar321 * fVar321;
    auVar366._4_4_ = fVar201 * fVar201 + fVar200 * fVar200 + fVar328 * fVar328;
    auVar366._8_4_ = fVar228 * fVar228 + fVar206 * fVar206 + fVar330 * fVar330;
    auVar366._12_4_ = fVar234 * fVar234 + fVar233 * fVar233 + fVar332 * fVar332;
    auVar366._16_4_ = fVar258 * fVar258 + fVar257 * fVar257 + fVar333 * fVar333;
    auVar366._20_4_ = fVar291 * fVar291 + fVar288 * fVar288 + fVar334 * fVar334;
    auVar366._24_4_ = fVar388 * fVar388 + fVar362 * fVar362 + fVar335 * fVar335;
    auVar366._28_4_ = local_2e0._28_4_ + local_2e0._28_4_ + fVar329;
    local_540 = (float)local_a20._0_4_ * fVar280 * local_5c0 +
                local_5c0 * fVar259 * (float)local_680._0_4_ +
                fVar276 * local_5c0 * (float)local_880._0_4_;
    fStack_53c = (float)local_a20._4_4_ * fVar198 * fStack_5bc +
                 fStack_5bc * fVar314 * (float)local_680._4_4_ +
                 fVar315 * fStack_5bc * (float)local_880._4_4_;
    fStack_538 = fStack_a18 * fVar204 * fStack_5b8 +
                 fStack_5b8 * fVar202 * fStack_678 + fVar203 * fStack_5b8 * fStack_878;
    fStack_534 = fStack_a14 * fVar231 * fStack_5b4 +
                 fStack_5b4 * fVar229 * fStack_674 + fVar230 * fStack_5b4 * fStack_874;
    fStack_530 = fStack_a10 * fVar255 * fStack_5b0 +
                 fStack_5b0 * fVar253 * fStack_670 + fVar254 * fStack_5b0 * fStack_870;
    fStack_52c = fStack_a0c * fVar281 * fStack_5ac +
                 fStack_5ac * fVar260 * fStack_66c + fVar277 * fStack_5ac * fStack_86c;
    fStack_528 = fStack_a08 * fVar22 * fStack_5a8 +
                 fStack_5a8 * fVar294 * fStack_668 + fVar297 * fStack_5a8 * fStack_868;
    fVar327 = fStack_a04 + fStack_664 + fStack_864;
    local_560 = fVar313 * fVar280 * local_5c0 +
                local_5c0 * fVar259 * fVar307 + fVar321 * fVar276 * local_5c0;
    fStack_55c = fVar201 * fVar198 * fStack_5bc +
                 fStack_5bc * fVar314 * fVar200 + fVar328 * fVar315 * fStack_5bc;
    fStack_558 = fVar228 * fVar204 * fStack_5b8 +
                 fStack_5b8 * fVar202 * fVar206 + fVar330 * fVar203 * fStack_5b8;
    fStack_554 = fVar234 * fVar231 * fStack_5b4 +
                 fStack_5b4 * fVar229 * fVar233 + fVar332 * fVar230 * fStack_5b4;
    fStack_550 = fVar258 * fVar255 * fStack_5b0 +
                 fStack_5b0 * fVar253 * fVar257 + fVar333 * fVar254 * fStack_5b0;
    fStack_54c = fVar291 * fVar281 * fStack_5ac +
                 fStack_5ac * fVar260 * fVar288 + fVar334 * fVar277 * fStack_5ac;
    fStack_548 = fVar388 * fVar22 * fStack_5a8 +
                 fStack_5a8 * fVar294 * fVar362 + fVar335 * fVar297 * fStack_5a8;
    fStack_544 = fStack_664 + fVar327;
    auVar45._4_4_ = fStack_53c * fStack_55c;
    auVar45._0_4_ = local_540 * local_560;
    auVar45._8_4_ = fStack_538 * fStack_558;
    auVar45._12_4_ = fStack_534 * fStack_554;
    auVar45._16_4_ = fStack_530 * fStack_550;
    auVar45._20_4_ = fStack_52c * fStack_54c;
    auVar45._24_4_ = fStack_528 * fStack_548;
    auVar45._28_4_ = fVar327;
    auVar220 = vsubps_avx(auVar353,auVar45);
    auVar46._4_4_ = fStack_55c * fStack_55c;
    auVar46._0_4_ = local_560 * local_560;
    auVar46._8_4_ = fStack_558 * fStack_558;
    auVar46._12_4_ = fStack_554 * fStack_554;
    auVar46._16_4_ = fStack_550 * fStack_550;
    auVar46._20_4_ = fStack_54c * fStack_54c;
    auVar46._24_4_ = fStack_548 * fStack_548;
    auVar46._28_4_ = fStack_664;
    local_620 = vsubps_avx(auVar366,auVar46);
    local_660 = vsqrtps_avx(auVar108);
    fVar327 = (local_660._0_4_ + auVar269._0_4_) * 1.0000002;
    fVar329 = (local_660._4_4_ + auVar269._4_4_) * 1.0000002;
    fVar331 = (local_660._8_4_ + auVar269._8_4_) * 1.0000002;
    fVar172 = (local_660._12_4_ + auVar269._12_4_) * 1.0000002;
    fVar173 = (local_660._16_4_ + auVar269._16_4_) * 1.0000002;
    fVar174 = (local_660._20_4_ + auVar269._20_4_) * 1.0000002;
    fVar175 = (local_660._24_4_ + auVar269._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar329 * fVar329;
    auVar47._0_4_ = fVar327 * fVar327;
    auVar47._8_4_ = fVar331 * fVar331;
    auVar47._12_4_ = fVar172 * fVar172;
    auVar47._16_4_ = fVar173 * fVar173;
    auVar47._20_4_ = fVar174 * fVar174;
    auVar47._24_4_ = fVar175 * fVar175;
    auVar47._28_4_ = local_660._28_4_ + auVar269._28_4_;
    local_9a0._0_4_ = auVar220._0_4_ + auVar220._0_4_;
    local_9a0._4_4_ = auVar220._4_4_ + auVar220._4_4_;
    local_9a0._8_4_ = auVar220._8_4_ + auVar220._8_4_;
    local_9a0._12_4_ = auVar220._12_4_ + auVar220._12_4_;
    local_9a0._16_4_ = auVar220._16_4_ + auVar220._16_4_;
    local_9a0._20_4_ = auVar220._20_4_ + auVar220._20_4_;
    local_9a0._24_4_ = auVar220._24_4_ + auVar220._24_4_;
    fVar327 = auVar220._28_4_;
    local_9a0._28_4_ = fVar327 + fVar327;
    auVar269 = vsubps_avx(local_620,auVar47);
    auVar48._4_4_ = fStack_53c * fStack_53c;
    auVar48._0_4_ = local_540 * local_540;
    auVar48._8_4_ = fStack_538 * fStack_538;
    auVar48._12_4_ = fStack_534 * fStack_534;
    auVar48._16_4_ = fStack_530 * fStack_530;
    auVar48._20_4_ = fStack_52c * fStack_52c;
    auVar48._24_4_ = fStack_528 * fStack_528;
    auVar48._28_4_ = fVar327;
    auVar220 = vsubps_avx(local_2c0,auVar48);
    auVar49._4_4_ = local_9a0._4_4_ * local_9a0._4_4_;
    auVar49._0_4_ = (float)local_9a0._0_4_ * (float)local_9a0._0_4_;
    auVar49._8_4_ = local_9a0._8_4_ * local_9a0._8_4_;
    auVar49._12_4_ = local_9a0._12_4_ * local_9a0._12_4_;
    auVar49._16_4_ = local_9a0._16_4_ * local_9a0._16_4_;
    auVar49._20_4_ = local_9a0._20_4_ * local_9a0._20_4_;
    auVar49._24_4_ = local_9a0._24_4_ * local_9a0._24_4_;
    auVar49._28_4_ = local_2c0._28_4_;
    fVar327 = auVar220._0_4_;
    local_640._0_4_ = fVar327 * 4.0;
    fVar329 = auVar220._4_4_;
    local_640._4_4_ = fVar329 * 4.0;
    fVar331 = auVar220._8_4_;
    fStack_638 = fVar331 * 4.0;
    fVar172 = auVar220._12_4_;
    fStack_634 = fVar172 * 4.0;
    fVar173 = auVar220._16_4_;
    fStack_630 = fVar173 * 4.0;
    fVar174 = auVar220._20_4_;
    fStack_62c = fVar174 * 4.0;
    fVar175 = auVar220._24_4_;
    fStack_628 = fVar175 * 4.0;
    uStack_624 = 0x40800000;
    auVar50._4_4_ = auVar269._4_4_ * (float)local_640._4_4_;
    auVar50._0_4_ = auVar269._0_4_ * (float)local_640._0_4_;
    auVar50._8_4_ = auVar269._8_4_ * fStack_638;
    auVar50._12_4_ = auVar269._12_4_ * fStack_634;
    auVar50._16_4_ = auVar269._16_4_ * fStack_630;
    auVar50._20_4_ = auVar269._20_4_ * fStack_62c;
    auVar50._24_4_ = auVar269._24_4_ * fStack_628;
    auVar50._28_4_ = 0x40800000;
    auVar32 = vsubps_avx(auVar49,auVar50);
    auVar108 = vcmpps_avx(auVar32,auVar221,5);
    auVar304._8_4_ = 0x7fffffff;
    auVar304._0_8_ = 0x7fffffff7fffffff;
    auVar304._12_4_ = 0x7fffffff;
    auVar304._16_4_ = 0x7fffffff;
    auVar304._20_4_ = 0x7fffffff;
    auVar304._24_4_ = 0x7fffffff;
    auVar304._28_4_ = 0x7fffffff;
    local_420 = vandps_avx(auVar48,auVar304);
    local_340._0_4_ = fVar327 + fVar327;
    local_340._4_4_ = fVar329 + fVar329;
    local_340._8_4_ = fVar331 + fVar331;
    local_340._12_4_ = fVar172 + fVar172;
    local_340._16_4_ = fVar173 + fVar173;
    local_340._20_4_ = fVar174 + fVar174;
    local_340._24_4_ = fVar175 + fVar175;
    local_340._28_4_ = auVar220._28_4_ + auVar220._28_4_;
    local_440 = vandps_avx(auVar220,auVar304);
    uVar84 = CONCAT44(local_9a0._4_4_,local_9a0._0_4_);
    local_320._0_8_ = uVar84 ^ 0x8000000080000000;
    local_320._8_4_ = -local_9a0._8_4_;
    local_320._12_4_ = -local_9a0._12_4_;
    local_320._16_4_ = -local_9a0._16_4_;
    local_320._20_4_ = -local_9a0._20_4_;
    local_320._24_4_ = -local_9a0._24_4_;
    local_320._28_4_ = -local_9a0._28_4_;
    fStack_524 = fStack_a04 + fStack_664 + fStack_864;
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0x7f,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar108 >> 0xbf,0) == '\0') &&
        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar108[0x1f])
    {
      auVar382._8_4_ = 0x7f800000;
      auVar382._0_8_ = 0x7f8000007f800000;
      auVar382._12_4_ = 0x7f800000;
      auVar382._16_4_ = 0x7f800000;
      auVar382._20_4_ = 0x7f800000;
      auVar382._24_4_ = 0x7f800000;
      auVar382._28_4_ = 0x7f800000;
      auVar166._8_4_ = 0xff800000;
      auVar166._0_8_ = 0xff800000ff800000;
      auVar166._12_4_ = 0xff800000;
      auVar166._16_4_ = 0xff800000;
      auVar166._20_4_ = 0xff800000;
      auVar166._24_4_ = 0xff800000;
      auVar166._28_4_ = 0xff800000;
    }
    else {
      auVar34 = vsqrtps_avx(auVar32);
      auVar33 = vrcpps_avx(local_340);
      auVar220 = vcmpps_avx(auVar32,auVar221,5);
      fVar327 = auVar33._0_4_;
      fVar329 = auVar33._4_4_;
      auVar51._4_4_ = local_340._4_4_ * fVar329;
      auVar51._0_4_ = local_340._0_4_ * fVar327;
      fVar331 = auVar33._8_4_;
      auVar51._8_4_ = local_340._8_4_ * fVar331;
      fVar172 = auVar33._12_4_;
      auVar51._12_4_ = local_340._12_4_ * fVar172;
      fVar173 = auVar33._16_4_;
      auVar51._16_4_ = local_340._16_4_ * fVar173;
      fVar174 = auVar33._20_4_;
      auVar51._20_4_ = local_340._20_4_ * fVar174;
      fVar175 = auVar33._24_4_;
      auVar51._24_4_ = local_340._24_4_ * fVar175;
      auVar51._28_4_ = auVar32._28_4_;
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = 0x3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar112._16_4_ = 0x3f800000;
      auVar112._20_4_ = 0x3f800000;
      auVar112._24_4_ = 0x3f800000;
      auVar112._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar112,auVar51);
      fVar327 = fVar327 + fVar327 * auVar32._0_4_;
      fVar329 = fVar329 + fVar329 * auVar32._4_4_;
      fVar331 = fVar331 + fVar331 * auVar32._8_4_;
      fVar172 = fVar172 + fVar172 * auVar32._12_4_;
      fVar173 = fVar173 + fVar173 * auVar32._16_4_;
      fVar174 = fVar174 + fVar174 * auVar32._20_4_;
      fVar175 = fVar175 + fVar175 * auVar32._24_4_;
      auVar221 = vsubps_avx(local_320,auVar34);
      fVar262 = auVar221._0_4_ * fVar327;
      fVar279 = auVar221._4_4_ * fVar329;
      auVar52._4_4_ = fVar279;
      auVar52._0_4_ = fVar262;
      fVar283 = auVar221._8_4_ * fVar331;
      auVar52._8_4_ = fVar283;
      fVar287 = auVar221._12_4_ * fVar172;
      auVar52._12_4_ = fVar287;
      fVar290 = auVar221._16_4_ * fVar173;
      auVar52._16_4_ = fVar290;
      fVar293 = auVar221._20_4_ * fVar174;
      auVar52._20_4_ = fVar293;
      fVar296 = auVar221._24_4_ * fVar175;
      auVar52._24_4_ = fVar296;
      auVar52._28_4_ = auVar221._28_4_;
      auVar221 = vsubps_avx(auVar34,local_9a0);
      fVar327 = auVar221._0_4_ * fVar327;
      fVar329 = auVar221._4_4_ * fVar329;
      auVar53._4_4_ = fVar329;
      auVar53._0_4_ = fVar327;
      fVar331 = auVar221._8_4_ * fVar331;
      auVar53._8_4_ = fVar331;
      fVar172 = auVar221._12_4_ * fVar172;
      auVar53._12_4_ = fVar172;
      fVar173 = auVar221._16_4_ * fVar173;
      auVar53._16_4_ = fVar173;
      fVar174 = auVar221._20_4_ * fVar174;
      auVar53._20_4_ = fVar174;
      fVar175 = auVar221._24_4_ * fVar175;
      auVar53._24_4_ = fVar175;
      auVar53._28_4_ = auVar33._28_4_ + auVar32._28_4_;
      local_3e0 = local_5c0 * (local_560 + local_540 * fVar262);
      fStack_3dc = fStack_5bc * (fStack_55c + fStack_53c * fVar279);
      fStack_3d8 = fStack_5b8 * (fStack_558 + fStack_538 * fVar283);
      fStack_3d4 = fStack_5b4 * (fStack_554 + fStack_534 * fVar287);
      fStack_3d0 = fStack_5b0 * (fStack_550 + fStack_530 * fVar290);
      fStack_3cc = fStack_5ac * (fStack_54c + fStack_52c * fVar293);
      fStack_3c8 = fStack_5a8 * (fStack_548 + fStack_528 * fVar296);
      uStack_3c4 = 0x3f800000;
      local_400 = local_5c0 * (local_560 + local_540 * fVar327);
      fStack_3fc = fStack_5bc * (fStack_55c + fStack_53c * fVar329);
      fStack_3f8 = fStack_5b8 * (fStack_558 + fStack_538 * fVar331);
      fStack_3f4 = fStack_5b4 * (fStack_554 + fStack_534 * fVar172);
      fStack_3f0 = fStack_5b0 * (fStack_550 + fStack_530 * fVar173);
      fStack_3ec = fStack_5ac * (fStack_54c + fStack_52c * fVar174);
      fStack_3e8 = fStack_5a8 * (fStack_548 + fStack_528 * fVar175);
      uStack_3e4 = 0x3f800000;
      auVar245._8_4_ = 0x7f800000;
      auVar245._0_8_ = 0x7f8000007f800000;
      auVar245._12_4_ = 0x7f800000;
      auVar245._16_4_ = 0x7f800000;
      auVar245._20_4_ = 0x7f800000;
      auVar245._24_4_ = 0x7f800000;
      auVar245._28_4_ = 0x7f800000;
      auVar382 = vblendvps_avx(auVar245,auVar52,auVar220);
      auVar246._8_4_ = 0xff800000;
      auVar246._0_8_ = 0xff800000ff800000;
      auVar246._12_4_ = 0xff800000;
      auVar246._16_4_ = 0xff800000;
      auVar246._20_4_ = 0xff800000;
      auVar246._24_4_ = 0xff800000;
      auVar246._28_4_ = 0xff800000;
      auVar166 = vblendvps_avx(auVar246,auVar53,auVar220);
      auVar32 = vmaxps_avx(local_5a0,local_420);
      auVar54._4_4_ = auVar32._4_4_ * 1.9073486e-06;
      auVar54._0_4_ = auVar32._0_4_ * 1.9073486e-06;
      auVar54._8_4_ = auVar32._8_4_ * 1.9073486e-06;
      auVar54._12_4_ = auVar32._12_4_ * 1.9073486e-06;
      auVar54._16_4_ = auVar32._16_4_ * 1.9073486e-06;
      auVar54._20_4_ = auVar32._20_4_ * 1.9073486e-06;
      auVar54._24_4_ = auVar32._24_4_ * 1.9073486e-06;
      auVar54._28_4_ = auVar32._28_4_;
      auVar32 = vcmpps_avx(local_440,auVar54,1);
      auVar221 = auVar220 & auVar32;
      if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar221 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar221 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar221 >> 0x7f,0) != '\0') ||
            (auVar221 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar221 >> 0xbf,0) != '\0') ||
          (auVar221 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar221[0x1f] < '\0') {
        auVar108 = vandps_avx(auVar32,auVar220);
        auVar184 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
        auVar32 = vcmpps_avx(auVar269,_DAT_01f7b000,2);
        auVar227._8_4_ = 0xff800000;
        auVar227._0_8_ = 0xff800000ff800000;
        auVar227._12_4_ = 0xff800000;
        auVar227._16_4_ = 0xff800000;
        auVar227._20_4_ = 0xff800000;
        auVar227._24_4_ = 0xff800000;
        auVar227._28_4_ = 0xff800000;
        auVar354._8_4_ = 0x7f800000;
        auVar354._0_8_ = 0x7f8000007f800000;
        auVar354._12_4_ = 0x7f800000;
        auVar354._16_4_ = 0x7f800000;
        auVar354._20_4_ = 0x7f800000;
        auVar354._24_4_ = 0x7f800000;
        auVar354._28_4_ = 0x7f800000;
        auVar269 = vblendvps_avx(auVar354,auVar227,auVar32);
        auVar265 = vpmovsxwd_avx(auVar184);
        auVar184 = vpunpckhwd_avx(auVar184,auVar184);
        auVar274._16_16_ = auVar184;
        auVar274._0_16_ = auVar265;
        auVar382 = vblendvps_avx(auVar382,auVar269,auVar274);
        auVar269 = vblendvps_avx(auVar227,auVar354,auVar32);
        auVar166 = vblendvps_avx(auVar166,auVar269,auVar274);
        auVar252._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
        auVar252._8_4_ = auVar108._8_4_ ^ 0xffffffff;
        auVar252._12_4_ = auVar108._12_4_ ^ 0xffffffff;
        auVar252._16_4_ = auVar108._16_4_ ^ 0xffffffff;
        auVar252._20_4_ = auVar108._20_4_ ^ 0xffffffff;
        auVar252._24_4_ = auVar108._24_4_ ^ 0xffffffff;
        auVar252._28_4_ = auVar108._28_4_ ^ 0xffffffff;
        auVar108 = vorps_avx(auVar32,auVar252);
        auVar108 = vandps_avx(auVar220,auVar108);
      }
    }
    auVar386 = ZEXT3264(local_940);
    auVar269 = local_500 & auVar108;
    auVar275 = ZEXT3264(local_980);
    fVar262 = (float)local_8a0._0_4_;
    fVar279 = (float)local_8a0._4_4_;
    fVar283 = fStack_898;
    fVar287 = fStack_894;
    fVar290 = fStack_890;
    fVar293 = fStack_88c;
    fVar296 = fStack_888;
    fVar316 = fStack_884;
    fVar327 = (float)local_a40._0_4_;
    fVar329 = (float)local_a40._4_4_;
    fVar331 = fStack_a38;
    fVar172 = fStack_a34;
    fVar173 = fStack_a30;
    fVar174 = fStack_a2c;
    fVar175 = fStack_a28;
    if ((((((((auVar269 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar269 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar269 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar269 >> 0x7f,0) == '\0') &&
          (auVar269 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar269 >> 0xbf,0) == '\0') &&
        (auVar269 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar269[0x1f])
    {
      auVar355 = ZEXT3264(local_ac0);
    }
    else {
      fStack_5a4 = auVar109._28_4_ + auVar195._28_4_;
      auVar386 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar184 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8f0._0_4_));
      auVar184 = vshufps_avx(auVar184,auVar184,0);
      auVar247._16_16_ = auVar184;
      auVar247._0_16_ = auVar184;
      auVar32 = vminps_avx(auVar247,auVar166);
      auVar113._0_4_ =
           (float)local_a20._0_4_ * fVar350 +
           (float)local_680._0_4_ * fVar336 + (float)local_880._0_4_ * fVar363;
      auVar113._4_4_ =
           (float)local_a20._4_4_ * fVar356 +
           (float)local_680._4_4_ * fVar344 + (float)local_880._4_4_ * fVar368;
      auVar113._8_4_ = fStack_a18 * fVar357 + fStack_678 * fVar345 + fStack_878 * fVar370;
      auVar113._12_4_ = fStack_a14 * fVar358 + fStack_674 * fVar346 + fStack_874 * fVar372;
      auVar113._16_4_ = fStack_a10 * fVar359 + fStack_670 * fVar347 + fStack_870 * fVar374;
      auVar113._20_4_ = fStack_a0c * fVar360 + fStack_66c * fVar348 + fStack_86c * fVar376;
      auVar113._24_4_ = fStack_a08 * fVar361 + fStack_668 * fVar349 + fStack_868 * fVar378;
      auVar113._28_4_ = fVar380 + auVar340._28_4_ + fVar380;
      auVar220 = vrcpps_avx(auVar113);
      fVar380 = auVar220._0_4_;
      fVar17 = auVar220._4_4_;
      auVar55._4_4_ = auVar113._4_4_ * fVar17;
      auVar55._0_4_ = auVar113._0_4_ * fVar380;
      fVar18 = auVar220._8_4_;
      auVar55._8_4_ = auVar113._8_4_ * fVar18;
      fVar19 = auVar220._12_4_;
      auVar55._12_4_ = auVar113._12_4_ * fVar19;
      fVar20 = auVar220._16_4_;
      auVar55._16_4_ = auVar113._16_4_ * fVar20;
      fVar21 = auVar220._20_4_;
      auVar55._20_4_ = auVar113._20_4_ * fVar21;
      fVar23 = auVar220._24_4_;
      auVar55._24_4_ = auVar113._24_4_ * fVar23;
      auVar55._28_4_ = local_ac0._28_4_ + auVar184._12_4_;
      auVar341._8_4_ = 0x3f800000;
      auVar341._0_8_ = 0x3f8000003f800000;
      auVar341._12_4_ = 0x3f800000;
      auVar341._16_4_ = 0x3f800000;
      auVar341._20_4_ = 0x3f800000;
      auVar341._24_4_ = 0x3f800000;
      auVar341._28_4_ = 0x3f800000;
      auVar221 = vsubps_avx(auVar341,auVar55);
      auVar271._8_4_ = 0x7fffffff;
      auVar271._0_8_ = 0x7fffffff7fffffff;
      auVar271._12_4_ = 0x7fffffff;
      auVar271._16_4_ = 0x7fffffff;
      auVar271._20_4_ = 0x7fffffff;
      auVar271._24_4_ = 0x7fffffff;
      auVar271._28_4_ = 0x7fffffff;
      auVar269 = vandps_avx(auVar113,auVar271);
      auVar367._8_4_ = 0x219392ef;
      auVar367._0_8_ = 0x219392ef219392ef;
      auVar367._12_4_ = 0x219392ef;
      auVar367._16_4_ = 0x219392ef;
      auVar367._20_4_ = 0x219392ef;
      auVar367._24_4_ = 0x219392ef;
      auVar367._28_4_ = 0x219392ef;
      auVar109 = vcmpps_avx(auVar269,auVar367,1);
      auVar56._4_4_ =
           (fVar17 + fVar17 * auVar221._4_4_) *
           -(fVar201 * fVar356 + fVar344 * fVar200 + fVar328 * fVar368);
      auVar56._0_4_ =
           (fVar380 + fVar380 * auVar221._0_4_) *
           -(fVar313 * fVar350 + fVar336 * fVar307 + fVar321 * fVar363);
      auVar56._8_4_ =
           (fVar18 + fVar18 * auVar221._8_4_) *
           -(fVar228 * fVar357 + fVar345 * fVar206 + fVar330 * fVar370);
      auVar56._12_4_ =
           (fVar19 + fVar19 * auVar221._12_4_) *
           -(fVar234 * fVar358 + fVar346 * fVar233 + fVar332 * fVar372);
      auVar56._16_4_ =
           (fVar20 + fVar20 * auVar221._16_4_) *
           -(fVar258 * fVar359 + fVar347 * fVar257 + fVar333 * fVar374);
      auVar56._20_4_ =
           (fVar21 + fVar21 * auVar221._20_4_) *
           -(fVar291 * fVar360 + fVar348 * fVar288 + fVar334 * fVar376);
      auVar56._24_4_ =
           (fVar23 + fVar23 * auVar221._24_4_) *
           -(fVar388 * fVar361 + fVar349 * fVar362 + fVar335 * fVar378);
      auVar56._28_4_ = auVar220._28_4_ + auVar221._28_4_;
      auVar220 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar269 = vcmpps_avx(auVar113,auVar220,1);
      auVar269 = vorps_avx(auVar109,auVar269);
      auVar319._8_4_ = 0xff800000;
      auVar319._0_8_ = 0xff800000ff800000;
      auVar319._12_4_ = 0xff800000;
      auVar319._16_4_ = 0xff800000;
      auVar319._20_4_ = 0xff800000;
      auVar319._24_4_ = 0xff800000;
      auVar319._28_4_ = 0xff800000;
      auVar269 = vblendvps_avx(auVar56,auVar319,auVar269);
      auVar220 = vcmpps_avx(auVar113,auVar220,6);
      auVar109 = vorps_avx(auVar109,auVar220);
      auVar326._8_4_ = 0x7f800000;
      auVar326._0_8_ = 0x7f8000007f800000;
      auVar326._12_4_ = 0x7f800000;
      auVar326._16_4_ = 0x7f800000;
      auVar326._20_4_ = 0x7f800000;
      auVar326._24_4_ = 0x7f800000;
      auVar326._28_4_ = 0x7f800000;
      auVar109 = vblendvps_avx(auVar56,auVar326,auVar109);
      auVar220 = vmaxps_avx(local_3c0,auVar382);
      auVar220 = vmaxps_avx(auVar220,auVar269);
      auVar32 = vminps_avx(auVar32,auVar109);
      auVar221 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar269 = vsubps_avx(auVar221,auVar144);
      auVar109 = vsubps_avx(auVar221,auVar302);
      auVar57._4_4_ = auVar109._4_4_ * -fVar120;
      auVar57._0_4_ = auVar109._0_4_ * -fVar92;
      auVar57._8_4_ = auVar109._8_4_ * -fVar122;
      auVar57._12_4_ = auVar109._12_4_ * -fVar124;
      auVar57._16_4_ = auVar109._16_4_ * -fVar125;
      auVar57._20_4_ = auVar109._20_4_ * -fVar126;
      auVar57._24_4_ = auVar109._24_4_ * -fVar127;
      auVar57._28_4_ = auVar109._28_4_;
      auVar58._4_4_ = fVar199 * auVar269._4_4_;
      auVar58._0_4_ = fVar284 * auVar269._0_4_;
      auVar58._8_4_ = fVar205 * auVar269._8_4_;
      auVar58._12_4_ = fVar232 * auVar269._12_4_;
      auVar58._16_4_ = fVar256 * auVar269._16_4_;
      auVar58._20_4_ = fVar285 * auVar269._20_4_;
      auVar58._24_4_ = fVar387 * auVar269._24_4_;
      auVar58._28_4_ = auVar269._28_4_;
      auVar269 = vsubps_avx(auVar57,auVar58);
      auVar109 = vsubps_avx(auVar221,auVar30);
      auVar59._4_4_ = fVar369 * auVar109._4_4_;
      auVar59._0_4_ = fVar364 * auVar109._0_4_;
      auVar59._8_4_ = fVar371 * auVar109._8_4_;
      auVar59._12_4_ = fVar373 * auVar109._12_4_;
      auVar59._16_4_ = fVar375 * auVar109._16_4_;
      auVar59._20_4_ = fVar377 * auVar109._20_4_;
      uVar89 = auVar109._28_4_;
      auVar59._24_4_ = fVar379 * auVar109._24_4_;
      auVar59._28_4_ = uVar89;
      auVar144 = vsubps_avx(auVar269,auVar59);
      auVar60._4_4_ = (float)local_880._4_4_ * -fVar120;
      auVar60._0_4_ = (float)local_880._0_4_ * -fVar92;
      auVar60._8_4_ = fStack_878 * -fVar122;
      auVar60._12_4_ = fStack_874 * -fVar124;
      auVar60._16_4_ = fStack_870 * -fVar125;
      auVar60._20_4_ = fStack_86c * -fVar126;
      auVar60._24_4_ = fStack_868 * -fVar127;
      auVar60._28_4_ = local_9e0._28_4_ ^ 0x80000000;
      auVar61._4_4_ = (float)local_680._4_4_ * fVar199;
      auVar61._0_4_ = (float)local_680._0_4_ * fVar284;
      auVar61._8_4_ = fStack_678 * fVar205;
      auVar61._12_4_ = fStack_674 * fVar232;
      auVar61._16_4_ = fStack_670 * fVar256;
      auVar61._20_4_ = fStack_66c * fVar285;
      auVar61._24_4_ = fStack_668 * fVar387;
      auVar61._28_4_ = uVar89;
      auVar269 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar369 * (float)local_a20._4_4_;
      auVar62._0_4_ = fVar364 * (float)local_a20._0_4_;
      auVar62._8_4_ = fVar371 * fStack_a18;
      auVar62._12_4_ = fVar373 * fStack_a14;
      auVar62._16_4_ = fVar375 * fStack_a10;
      auVar62._20_4_ = fVar377 * fStack_a0c;
      auVar62._24_4_ = fVar379 * fStack_a08;
      auVar62._28_4_ = uVar89;
      auVar302 = vsubps_avx(auVar269,auVar62);
      auVar269 = vrcpps_avx(auVar302);
      fVar284 = auVar269._0_4_;
      fVar307 = auVar269._4_4_;
      auVar63._4_4_ = auVar302._4_4_ * fVar307;
      auVar63._0_4_ = auVar302._0_4_ * fVar284;
      fVar313 = auVar269._8_4_;
      auVar63._8_4_ = auVar302._8_4_ * fVar313;
      fVar199 = auVar269._12_4_;
      auVar63._12_4_ = auVar302._12_4_ * fVar199;
      fVar200 = auVar269._16_4_;
      auVar63._16_4_ = auVar302._16_4_ * fVar200;
      fVar201 = auVar269._20_4_;
      auVar63._20_4_ = auVar302._20_4_ * fVar201;
      fVar205 = auVar269._24_4_;
      auVar63._24_4_ = auVar302._24_4_ * fVar205;
      auVar63._28_4_ = fStack_864;
      auVar30 = vsubps_avx(auVar341,auVar63);
      auVar269 = vandps_avx(auVar302,auVar271);
      auVar272._8_4_ = 0x219392ef;
      auVar272._0_8_ = 0x219392ef219392ef;
      auVar272._12_4_ = 0x219392ef;
      auVar272._16_4_ = 0x219392ef;
      auVar272._20_4_ = 0x219392ef;
      auVar272._24_4_ = 0x219392ef;
      auVar272._28_4_ = 0x219392ef;
      auVar109 = vcmpps_avx(auVar269,auVar272,1);
      auVar64._4_4_ = (fVar307 + fVar307 * auVar30._4_4_) * -auVar144._4_4_;
      auVar64._0_4_ = (fVar284 + fVar284 * auVar30._0_4_) * -auVar144._0_4_;
      auVar64._8_4_ = (fVar313 + fVar313 * auVar30._8_4_) * -auVar144._8_4_;
      auVar64._12_4_ = (fVar199 + fVar199 * auVar30._12_4_) * -auVar144._12_4_;
      auVar64._16_4_ = (fVar200 + fVar200 * auVar30._16_4_) * -auVar144._16_4_;
      auVar64._20_4_ = (fVar201 + fVar201 * auVar30._20_4_) * -auVar144._20_4_;
      auVar64._24_4_ = (fVar205 + fVar205 * auVar30._24_4_) * -auVar144._24_4_;
      auVar64._28_4_ = auVar144._28_4_ ^ 0x80000000;
      auVar269 = vcmpps_avx(auVar302,ZEXT832(0) << 0x20,1);
      auVar269 = vorps_avx(auVar109,auVar269);
      auVar269 = vblendvps_avx(auVar64,auVar319,auVar269);
      local_6a0 = vmaxps_avx(auVar220,auVar269);
      auVar269 = vcmpps_avx(auVar302,ZEXT832(0) << 0x20,6);
      auVar269 = vorps_avx(auVar109,auVar269);
      auVar269 = vblendvps_avx(auVar64,auVar326,auVar269);
      auVar108 = vandps_avx(local_500,auVar108);
      local_460 = vminps_avx(auVar32,auVar269);
      auVar269 = vcmpps_avx(local_6a0,local_460,2);
      auVar109 = auVar108 & auVar269;
      if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0x7f,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar109 >> 0xbf,0) != '\0') ||
          (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar109[0x1f] < '\0') {
        auVar109 = vminps_avx(auVar270,local_600);
        auVar144 = vminps_avx(auVar29,auVar31);
        auVar109 = vminps_avx(auVar109,auVar144);
        auVar109 = vsubps_avx(auVar109,local_660);
        auVar108 = vandps_avx(auVar269,auVar108);
        auVar79._4_4_ = fStack_3dc;
        auVar79._0_4_ = local_3e0;
        auVar79._8_4_ = fStack_3d8;
        auVar79._12_4_ = fStack_3d4;
        auVar79._16_4_ = fStack_3d0;
        auVar79._20_4_ = fStack_3cc;
        auVar79._24_4_ = fStack_3c8;
        auVar79._28_4_ = uStack_3c4;
        auVar269 = vminps_avx(auVar79,auVar341);
        auVar218 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar269 = vmaxps_avx(auVar269,ZEXT832(0) << 0x20);
        fVar284 = DAT_01f7b060._28_4_;
        local_1a0[0] = fVar389 + fVar128 * (auVar269._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1a0[1] = fVar119 + fVar155 * (auVar269._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1a0[2] = fVar121 + fVar156 * (auVar269._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1a0[3] = fVar123 + fVar157 * (auVar269._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_190 = fVar389 + fVar128 * (auVar269._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_18c = fVar119 + fVar155 * (auVar269._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_188 = fVar121 + fVar156 * (auVar269._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_184 = fVar123 + auVar269._28_4_ + fVar284;
        auVar78._4_4_ = fStack_3fc;
        auVar78._0_4_ = local_400;
        auVar78._8_4_ = fStack_3f8;
        auVar78._12_4_ = fStack_3f4;
        auVar78._16_4_ = fStack_3f0;
        auVar78._20_4_ = fStack_3ec;
        auVar78._24_4_ = fStack_3e8;
        auVar78._28_4_ = uStack_3e4;
        auVar269 = vminps_avx(auVar78,auVar341);
        auVar269 = vmaxps_avx(auVar269,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar389 + fVar128 * (auVar269._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1c0[1] = fVar119 + fVar155 * (auVar269._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1c0[2] = fVar121 + fVar156 * (auVar269._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1c0[3] = fVar123 + fVar157 * (auVar269._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_1b0 = fVar389 + fVar128 * (auVar269._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_1ac = fVar119 + fVar155 * (auVar269._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_1a8 = fVar121 + fVar156 * (auVar269._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_1a4 = fVar123 + auVar269._28_4_ + fVar284;
        auVar65._4_4_ = auVar109._4_4_ * 0.99999976;
        auVar65._0_4_ = auVar109._0_4_ * 0.99999976;
        auVar65._8_4_ = auVar109._8_4_ * 0.99999976;
        auVar65._12_4_ = auVar109._12_4_ * 0.99999976;
        auVar65._16_4_ = auVar109._16_4_ * 0.99999976;
        auVar65._20_4_ = auVar109._20_4_ * 0.99999976;
        auVar65._24_4_ = auVar109._24_4_ * 0.99999976;
        auVar65._28_4_ = 0x3f7ffffc;
        auVar269 = vmaxps_avx(ZEXT832(0) << 0x20,auVar65);
        auVar66._4_4_ = auVar269._4_4_ * auVar269._4_4_;
        auVar66._0_4_ = auVar269._0_4_ * auVar269._0_4_;
        auVar66._8_4_ = auVar269._8_4_ * auVar269._8_4_;
        auVar66._12_4_ = auVar269._12_4_ * auVar269._12_4_;
        auVar66._16_4_ = auVar269._16_4_ * auVar269._16_4_;
        auVar66._20_4_ = auVar269._20_4_ * auVar269._20_4_;
        auVar66._24_4_ = auVar269._24_4_ * auVar269._24_4_;
        auVar66._28_4_ = auVar269._28_4_;
        local_a80 = vsubps_avx(local_620,auVar66);
        auVar67._4_4_ = local_a80._4_4_ * (float)local_640._4_4_;
        auVar67._0_4_ = local_a80._0_4_ * (float)local_640._0_4_;
        auVar67._8_4_ = local_a80._8_4_ * fStack_638;
        auVar67._12_4_ = local_a80._12_4_ * fStack_634;
        auVar67._16_4_ = local_a80._16_4_ * fStack_630;
        auVar67._20_4_ = local_a80._20_4_ * fStack_62c;
        auVar67._24_4_ = local_a80._24_4_ * fStack_628;
        auVar67._28_4_ = auVar269._28_4_;
        auVar109 = vsubps_avx(auVar49,auVar67);
        auVar269 = vcmpps_avx(auVar109,ZEXT832(0) << 0x20,5);
        if ((((((((auVar269 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar269 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar269 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar269 >> 0x7f,0) == '\0') &&
              (auVar269 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar269 >> 0xbf,0) == '\0') &&
            (auVar269 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar269[0x1f]) {
          auVar268 = SUB3228(ZEXT832(0),0) << 0x40;
          auVar242 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar385 = ZEXT1228(ZEXT812(0)) << 0x20;
          _local_ae0 = ZEXT832(0) << 0x20;
          _local_c20 = local_ae0._0_28_;
          auVar305._8_4_ = 0x7f800000;
          auVar305._0_8_ = 0x7f8000007f800000;
          auVar305._12_4_ = 0x7f800000;
          auVar305._16_4_ = 0x7f800000;
          auVar305._20_4_ = 0x7f800000;
          auVar305._24_4_ = 0x7f800000;
          auVar305._28_4_ = 0x7f800000;
          auVar342._8_4_ = 0xff800000;
          auVar342._0_8_ = 0xff800000ff800000;
          auVar342._12_4_ = 0xff800000;
          auVar342._16_4_ = 0xff800000;
          auVar342._20_4_ = 0xff800000;
          auVar342._24_4_ = 0xff800000;
          auVar342._28_4_ = 0xff800000;
          local_a80 = auVar35;
        }
        else {
          auVar144 = vrcpps_avx(local_340);
          fVar307 = auVar144._0_4_;
          auVar222._0_4_ = local_340._0_4_ * fVar307;
          fVar313 = auVar144._4_4_;
          auVar222._4_4_ = local_340._4_4_ * fVar313;
          fVar199 = auVar144._8_4_;
          auVar222._8_4_ = local_340._8_4_ * fVar199;
          fVar200 = auVar144._12_4_;
          auVar222._12_4_ = local_340._12_4_ * fVar200;
          fVar201 = auVar144._16_4_;
          auVar222._16_4_ = local_340._16_4_ * fVar201;
          fVar205 = auVar144._20_4_;
          auVar222._20_4_ = local_340._20_4_ * fVar205;
          fVar206 = auVar144._24_4_;
          auVar222._24_4_ = local_340._24_4_ * fVar206;
          auVar222._28_4_ = 0;
          auVar29 = vsubps_avx(auVar341,auVar222);
          auVar302 = vsqrtps_avx(auVar109);
          fVar307 = fVar307 + fVar307 * auVar29._0_4_;
          fVar313 = fVar313 + fVar313 * auVar29._4_4_;
          fVar199 = fVar199 + fVar199 * auVar29._8_4_;
          fVar200 = fVar200 + fVar200 * auVar29._12_4_;
          fVar201 = fVar201 + fVar201 * auVar29._16_4_;
          fVar205 = fVar205 + fVar205 * auVar29._20_4_;
          fVar206 = fVar206 + fVar206 * auVar29._24_4_;
          auVar30 = vsubps_avx(local_320,auVar302);
          fVar285 = auVar30._0_4_ * fVar307;
          fVar288 = auVar30._4_4_ * fVar313;
          auVar68._4_4_ = fVar288;
          auVar68._0_4_ = fVar285;
          fVar291 = auVar30._8_4_ * fVar199;
          auVar68._8_4_ = fVar291;
          fVar387 = auVar30._12_4_ * fVar200;
          auVar68._12_4_ = fVar387;
          fVar362 = auVar30._16_4_ * fVar201;
          auVar68._16_4_ = fVar362;
          fVar388 = auVar30._20_4_ * fVar205;
          auVar68._20_4_ = fVar388;
          fVar389 = auVar30._24_4_ * fVar206;
          auVar68._24_4_ = fVar389;
          auVar68._28_4_ = fStack_664;
          auVar30 = vsubps_avx(auVar302,local_9a0);
          fVar307 = auVar30._0_4_ * fVar307;
          fVar313 = auVar30._4_4_ * fVar313;
          auVar69._4_4_ = fVar313;
          auVar69._0_4_ = fVar307;
          fVar199 = auVar30._8_4_ * fVar199;
          auVar69._8_4_ = fVar199;
          fVar200 = auVar30._12_4_ * fVar200;
          auVar69._12_4_ = fVar200;
          fVar201 = auVar30._16_4_ * fVar201;
          auVar69._16_4_ = fVar201;
          fVar205 = auVar30._20_4_ * fVar205;
          auVar69._20_4_ = fVar205;
          fVar206 = auVar30._24_4_ * fVar206;
          auVar69._24_4_ = fVar206;
          auVar69._28_4_ = fVar157;
          fVar228 = (fVar285 * local_540 + local_560) * local_5c0;
          fVar232 = (fVar288 * fStack_53c + fStack_55c) * fStack_5bc;
          fVar233 = (fVar291 * fStack_538 + fStack_558) * fStack_5b8;
          fVar234 = (fVar387 * fStack_534 + fStack_554) * fStack_5b4;
          fVar256 = (fVar362 * fStack_530 + fStack_550) * fStack_5b0;
          fVar257 = (fVar388 * fStack_52c + fStack_54c) * fStack_5ac;
          fVar258 = (fVar389 * fStack_528 + fStack_548) * fStack_5a8;
          auVar167._0_4_ = fVar261 + fVar228 * fVar280;
          auVar167._4_4_ = fVar278 + fVar232 * fVar198;
          auVar167._8_4_ = fVar282 + fVar233 * fVar204;
          auVar167._12_4_ = fVar286 + fVar234 * fVar231;
          auVar167._16_4_ = fVar289 + fVar256 * fVar255;
          auVar167._20_4_ = fVar292 + fVar257 * fVar281;
          auVar167._24_4_ = fVar295 + fVar258 * fVar22;
          auVar167._28_4_ = fVar298 + auVar144._28_4_ + auVar29._28_4_ + fStack_544;
          auVar70._4_4_ = fVar288 * (float)local_a20._4_4_;
          auVar70._0_4_ = fVar285 * (float)local_a20._0_4_;
          auVar70._8_4_ = fVar291 * fStack_a18;
          auVar70._12_4_ = fVar387 * fStack_a14;
          auVar70._16_4_ = fVar362 * fStack_a10;
          auVar70._20_4_ = fVar388 * fStack_a0c;
          auVar70._24_4_ = fVar389 * fStack_a08;
          auVar70._28_4_ = auVar302._28_4_;
          local_960 = vsubps_avx(auVar70,auVar167);
          auVar248._0_4_ = (float)local_a00._0_4_ + fVar228 * fVar259;
          auVar248._4_4_ = local_a00._4_4_ + fVar232 * fVar314;
          auVar248._8_4_ = local_a00._8_4_ + fVar233 * fVar202;
          auVar248._12_4_ = local_a00._12_4_ + fVar234 * fVar229;
          auVar248._16_4_ = local_a00._16_4_ + fVar256 * fVar253;
          auVar248._20_4_ = local_a00._20_4_ + fVar257 * fVar260;
          auVar248._24_4_ = local_a00._24_4_ + fVar258 * fVar294;
          auVar248._28_4_ = local_a00._28_4_ + auVar302._28_4_;
          auVar80._4_4_ = (float)local_680._4_4_ * fVar288;
          auVar80._0_4_ = (float)local_680._0_4_ * fVar285;
          auVar80._8_4_ = fStack_678 * fVar291;
          auVar80._12_4_ = fStack_674 * fVar387;
          auVar80._16_4_ = fStack_670 * fVar362;
          auVar80._20_4_ = fStack_66c * fVar388;
          auVar80._24_4_ = fStack_668 * fVar389;
          auVar80._28_4_ = fVar284;
          auVar144 = vsubps_avx(auVar80,auVar248);
          _local_c20 = auVar144._0_28_;
          auVar223._0_4_ = local_2e0._0_4_ + fVar276 * fVar228;
          auVar223._4_4_ = local_2e0._4_4_ + fVar315 * fVar232;
          auVar223._8_4_ = local_2e0._8_4_ + fVar203 * fVar233;
          auVar223._12_4_ = local_2e0._12_4_ + fVar230 * fVar234;
          auVar223._16_4_ = local_2e0._16_4_ + fVar254 * fVar256;
          auVar223._20_4_ = local_2e0._20_4_ + fVar277 * fVar257;
          auVar223._24_4_ = local_2e0._24_4_ + fVar297 * fVar258;
          auVar223._28_4_ = local_2e0._28_4_ + auVar30._28_4_;
          auVar71._4_4_ = fVar288 * (float)local_880._4_4_;
          auVar71._0_4_ = fVar285 * (float)local_880._0_4_;
          auVar71._8_4_ = fVar291 * fStack_878;
          auVar71._12_4_ = fVar387 * fStack_874;
          auVar71._16_4_ = fVar362 * fStack_870;
          auVar71._20_4_ = fVar388 * fStack_86c;
          auVar71._24_4_ = fVar389 * fStack_868;
          auVar71._28_4_ = auVar248._28_4_;
          _local_ae0 = vsubps_avx(auVar71,auVar223);
          fVar228 = (fVar307 * local_540 + local_560) * local_5c0;
          fVar232 = (fVar313 * fStack_53c + fStack_55c) * fStack_5bc;
          fVar233 = (fVar199 * fStack_538 + fStack_558) * fStack_5b8;
          fVar234 = (fVar200 * fStack_534 + fStack_554) * fStack_5b4;
          fVar256 = (fVar201 * fStack_530 + fStack_550) * fStack_5b0;
          fVar257 = (fVar205 * fStack_52c + fStack_54c) * fStack_5ac;
          fVar258 = (fVar206 * fStack_528 + fStack_548) * fStack_5a8;
          auVar224._0_4_ = fVar261 + fVar228 * fVar280;
          auVar224._4_4_ = fVar278 + fVar232 * fVar198;
          auVar224._8_4_ = fVar282 + fVar233 * fVar204;
          auVar224._12_4_ = fVar286 + fVar234 * fVar231;
          auVar224._16_4_ = fVar289 + fVar256 * fVar255;
          auVar224._20_4_ = fVar292 + fVar257 * fVar281;
          auVar224._24_4_ = fVar295 + fVar258 * fVar22;
          auVar224._28_4_ = fVar298 + local_ae0._28_4_ + fStack_544;
          auVar72._4_4_ = fVar313 * (float)local_a20._4_4_;
          auVar72._0_4_ = fVar307 * (float)local_a20._0_4_;
          auVar72._8_4_ = fVar199 * fStack_a18;
          auVar72._12_4_ = fVar200 * fStack_a14;
          auVar72._16_4_ = fVar201 * fStack_a10;
          auVar72._20_4_ = fVar205 * fStack_a0c;
          auVar72._24_4_ = fVar206 * fStack_a08;
          auVar72._28_4_ = fVar284;
          auVar144 = vsubps_avx(auVar72,auVar224);
          auVar218 = auVar144._0_28_;
          auVar273._0_4_ = (float)local_a00._0_4_ + fVar228 * fVar259;
          auVar273._4_4_ = local_a00._4_4_ + fVar232 * fVar314;
          auVar273._8_4_ = local_a00._8_4_ + fVar233 * fVar202;
          auVar273._12_4_ = local_a00._12_4_ + fVar234 * fVar229;
          auVar273._16_4_ = local_a00._16_4_ + fVar256 * fVar253;
          auVar273._20_4_ = local_a00._20_4_ + fVar257 * fVar260;
          auVar273._24_4_ = local_a00._24_4_ + fVar258 * fVar294;
          auVar273._28_4_ = local_a00._28_4_ + fVar284;
          auVar73._4_4_ = (float)local_680._4_4_ * fVar313;
          auVar73._0_4_ = (float)local_680._0_4_ * fVar307;
          auVar73._8_4_ = fStack_678 * fVar199;
          auVar73._12_4_ = fStack_674 * fVar200;
          auVar73._16_4_ = fStack_670 * fVar201;
          auVar73._20_4_ = fStack_66c * fVar205;
          auVar73._24_4_ = fStack_668 * fVar206;
          auVar73._28_4_ = fStack_a04;
          auVar144 = vsubps_avx(auVar73,auVar273);
          auVar268 = auVar144._0_28_;
          auVar249._0_4_ = local_2e0._0_4_ + fVar276 * fVar228;
          auVar249._4_4_ = local_2e0._4_4_ + fVar315 * fVar232;
          auVar249._8_4_ = local_2e0._8_4_ + fVar203 * fVar233;
          auVar249._12_4_ = local_2e0._12_4_ + fVar230 * fVar234;
          auVar249._16_4_ = local_2e0._16_4_ + fVar254 * fVar256;
          auVar249._20_4_ = local_2e0._20_4_ + fVar277 * fVar257;
          auVar249._24_4_ = local_2e0._24_4_ + fVar297 * fVar258;
          auVar249._28_4_ = local_2e0._28_4_ + auVar248._28_4_;
          auVar74._4_4_ = fVar313 * (float)local_880._4_4_;
          auVar74._0_4_ = fVar307 * (float)local_880._0_4_;
          auVar74._8_4_ = fVar199 * fStack_878;
          auVar74._12_4_ = fVar200 * fStack_874;
          auVar74._16_4_ = fVar201 * fStack_870;
          auVar74._20_4_ = fVar205 * fStack_86c;
          auVar74._24_4_ = fVar206 * fStack_868;
          auVar74._28_4_ = fStack_a04;
          auVar144 = vsubps_avx(auVar74,auVar249);
          auVar242 = auVar144._0_28_;
          auVar109 = vcmpps_avx(auVar109,ZEXT832(0) << 0x20,5);
          auVar306._8_4_ = 0x7f800000;
          auVar306._0_8_ = 0x7f8000007f800000;
          auVar306._12_4_ = 0x7f800000;
          auVar306._16_4_ = 0x7f800000;
          auVar306._20_4_ = 0x7f800000;
          auVar306._24_4_ = 0x7f800000;
          auVar306._28_4_ = 0x7f800000;
          auVar305 = vblendvps_avx(auVar306,auVar68,auVar109);
          auVar144 = vmaxps_avx(local_5a0,local_420);
          auVar75._4_4_ = auVar144._4_4_ * 1.9073486e-06;
          auVar75._0_4_ = auVar144._0_4_ * 1.9073486e-06;
          auVar75._8_4_ = auVar144._8_4_ * 1.9073486e-06;
          auVar75._12_4_ = auVar144._12_4_ * 1.9073486e-06;
          auVar75._16_4_ = auVar144._16_4_ * 1.9073486e-06;
          auVar75._20_4_ = auVar144._20_4_ * 1.9073486e-06;
          auVar75._24_4_ = auVar144._24_4_ * 1.9073486e-06;
          auVar75._28_4_ = auVar144._28_4_;
          auVar144 = vcmpps_avx(local_440,auVar75,1);
          auVar343._8_4_ = 0xff800000;
          auVar343._0_8_ = 0xff800000ff800000;
          auVar343._12_4_ = 0xff800000;
          auVar343._16_4_ = 0xff800000;
          auVar343._20_4_ = 0xff800000;
          auVar343._24_4_ = 0xff800000;
          auVar343._28_4_ = 0xff800000;
          auVar342 = vblendvps_avx(auVar343,auVar69,auVar109);
          auVar302 = auVar109 & auVar144;
          if ((((((((auVar302 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar302 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar302 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar302 >> 0x7f,0) != '\0') ||
                (auVar302 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar302 >> 0xbf,0) != '\0') ||
              (auVar302 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar302[0x1f] < '\0') {
            auVar269 = vandps_avx(auVar144,auVar109);
            auVar184 = vpackssdw_avx(auVar269._0_16_,auVar269._16_16_);
            auVar302 = vcmpps_avx(local_a80,_DAT_01f7b000,2);
            auVar154._8_4_ = 0xff800000;
            auVar154._0_8_ = 0xff800000ff800000;
            auVar154._12_4_ = 0xff800000;
            auVar154._16_4_ = 0xff800000;
            auVar154._20_4_ = 0xff800000;
            auVar154._24_4_ = 0xff800000;
            auVar154._28_4_ = 0xff800000;
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar144 = vblendvps_avx(auVar171,auVar154,auVar302);
            auVar265 = vpmovsxwd_avx(auVar184);
            auVar184 = vpunpckhwd_avx(auVar184,auVar184);
            auVar383._16_16_ = auVar184;
            auVar383._0_16_ = auVar265;
            auVar305 = vblendvps_avx(auVar305,auVar144,auVar383);
            auVar144 = vblendvps_avx(auVar154,auVar171,auVar302);
            auVar342 = vblendvps_avx(auVar342,auVar144,auVar383);
            auVar197._0_8_ = auVar269._0_8_ ^ 0xffffffffffffffff;
            auVar197._8_4_ = auVar269._8_4_ ^ 0xffffffff;
            auVar197._12_4_ = auVar269._12_4_ ^ 0xffffffff;
            auVar197._16_4_ = auVar269._16_4_ ^ 0xffffffff;
            auVar197._20_4_ = auVar269._20_4_ ^ 0xffffffff;
            auVar197._24_4_ = auVar269._24_4_ ^ 0xffffffff;
            auVar197._28_4_ = auVar269._28_4_ ^ 0xffffffff;
            auVar269 = vorps_avx(auVar302,auVar197);
            auVar269 = vandps_avx(auVar109,auVar269);
          }
          auVar385 = local_960._0_28_;
        }
        _local_4c0 = local_6a0;
        local_4a0 = vminps_avx(local_460,auVar305);
        _local_800 = vmaxps_avx(local_6a0,auVar342);
        _local_480 = _local_800;
        auVar109 = vcmpps_avx(local_6a0,local_4a0,2);
        local_600 = vandps_avx(auVar108,auVar109);
        auVar109 = vcmpps_avx(_local_800,local_460,2);
        local_840 = vandps_avx(auVar108,auVar109);
        auVar108 = vorps_avx(local_840,local_600);
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0x7f,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar108 >> 0xbf,0) != '\0') ||
            (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar108[0x1f] < '\0') {
          auStack_8b8 = auVar31._8_24_;
          auVar146._0_8_ = auVar269._0_8_ ^ 0xffffffffffffffff;
          auVar146._8_4_ = auVar269._8_4_ ^ 0xffffffff;
          auVar146._12_4_ = auVar269._12_4_ ^ 0xffffffff;
          auVar146._16_4_ = auVar269._16_4_ ^ 0xffffffff;
          auVar146._20_4_ = auVar269._20_4_ ^ 0xffffffff;
          auVar146._24_4_ = auVar269._24_4_ ^ 0xffffffff;
          fVar327 = auVar269._28_4_;
          auVar146._28_4_ = (uint)fVar327 ^ 0xffffffff;
          auVar115._0_4_ =
               (float)local_a20._0_4_ * auVar218._0_4_ +
               (float)local_680._0_4_ * auVar268._0_4_ + (float)local_880._0_4_ * auVar242._0_4_;
          auVar115._4_4_ =
               (float)local_a20._4_4_ * auVar218._4_4_ +
               (float)local_680._4_4_ * auVar268._4_4_ + (float)local_880._4_4_ * auVar242._4_4_;
          auVar115._8_4_ =
               fStack_a18 * auVar218._8_4_ +
               fStack_678 * auVar268._8_4_ + fStack_878 * auVar242._8_4_;
          auVar115._12_4_ =
               fStack_a14 * auVar218._12_4_ +
               fStack_674 * auVar268._12_4_ + fStack_874 * auVar242._12_4_;
          auVar115._16_4_ =
               fStack_a10 * auVar218._16_4_ +
               fStack_670 * auVar268._16_4_ + fStack_870 * auVar242._16_4_;
          auVar115._20_4_ =
               fStack_a0c * auVar218._20_4_ +
               fStack_66c * auVar268._20_4_ + fStack_86c * auVar242._20_4_;
          auVar115._24_4_ =
               fStack_a08 * auVar218._24_4_ +
               fStack_668 * auVar268._24_4_ + fStack_868 * auVar242._24_4_;
          auVar115._28_4_ = fVar327 + local_840._28_4_ + auVar108._28_4_;
          auVar225._8_4_ = 0x7fffffff;
          auVar225._0_8_ = 0x7fffffff7fffffff;
          auVar225._12_4_ = 0x7fffffff;
          auVar225._16_4_ = 0x7fffffff;
          auVar225._20_4_ = 0x7fffffff;
          auVar225._24_4_ = 0x7fffffff;
          auVar225._28_4_ = 0x7fffffff;
          auVar108 = vandps_avx(auVar115,auVar225);
          auVar250._8_4_ = 0x3e99999a;
          auVar250._0_8_ = 0x3e99999a3e99999a;
          auVar250._12_4_ = 0x3e99999a;
          auVar250._16_4_ = 0x3e99999a;
          auVar250._20_4_ = 0x3e99999a;
          auVar250._24_4_ = 0x3e99999a;
          auVar250._28_4_ = 0x3e99999a;
          auVar108 = vcmpps_avx(auVar108,auVar250,1);
          _local_640 = vorps_avx(auVar108,auVar146);
          auVar116._0_4_ =
               auVar385._0_4_ * (float)local_a20._0_4_ +
               (float)local_680._0_4_ * (float)local_c20._0_4_ +
               (float)local_880._0_4_ * (float)local_ae0._0_4_;
          auVar116._4_4_ =
               auVar385._4_4_ * (float)local_a20._4_4_ +
               (float)local_680._4_4_ * (float)local_c20._4_4_ +
               (float)local_880._4_4_ * (float)local_ae0._4_4_;
          auVar116._8_4_ =
               auVar385._8_4_ * fStack_a18 + fStack_678 * fStack_c18 + fStack_878 * fStack_ad8;
          auVar116._12_4_ =
               auVar385._12_4_ * fStack_a14 + fStack_674 * fStack_c14 + fStack_874 * fStack_ad4;
          auVar116._16_4_ =
               auVar385._16_4_ * fStack_a10 + fStack_670 * fStack_c10 + fStack_870 * fStack_ad0;
          auVar116._20_4_ =
               auVar385._20_4_ * fStack_a0c + fStack_66c * fStack_c0c + fStack_86c * fStack_acc;
          auVar116._24_4_ =
               auVar385._24_4_ * fStack_a08 + fStack_668 * fStack_c08 + fStack_868 * fStack_ac8;
          auVar116._28_4_ = local_640._28_4_ + local_600._28_4_ + fVar327;
          auVar108 = vandps_avx(auVar116,auVar225);
          auVar108 = vcmpps_avx(auVar108,auVar250,1);
          auVar108 = vorps_avx(auVar108,auVar146);
          auVar147._8_4_ = 3;
          auVar147._0_8_ = 0x300000003;
          auVar147._12_4_ = 3;
          auVar147._16_4_ = 3;
          auVar147._20_4_ = 3;
          auVar147._24_4_ = 3;
          auVar147._28_4_ = 3;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar169,auVar147,auVar108);
          local_660 = ZEXT432(local_c48);
          auVar265 = vpshufd_avx(ZEXT416(local_c48),0);
          auVar184 = vpcmpgtd_avx(auVar108._16_16_,auVar265);
          local_6c0._0_16_ = auVar265;
          auVar265 = vpcmpgtd_avx(auVar108._0_16_,auVar265);
          auVar148._16_16_ = auVar184;
          auVar148._0_16_ = auVar265;
          local_620 = vblendps_avx(ZEXT1632(auVar265),auVar148,0xf0);
          auVar108 = vandnps_avx(local_620,local_600);
          local_820._4_4_ = local_6a0._4_4_ + (float)local_8a0._4_4_;
          local_820._0_4_ = local_6a0._0_4_ + (float)local_8a0._0_4_;
          fStack_818 = local_6a0._8_4_ + fStack_898;
          fStack_814 = local_6a0._12_4_ + fStack_894;
          fStack_810 = local_6a0._16_4_ + fStack_890;
          fStack_80c = local_6a0._20_4_ + fStack_88c;
          fStack_808 = local_6a0._24_4_ + fStack_888;
          fStack_804 = local_6a0._28_4_ + fStack_884;
          while( true ) {
            local_4e0 = auVar108;
            local_b20 = auVar27._0_4_;
            fStack_b1c = auVar27._4_4_;
            fStack_b18 = auVar27._8_4_;
            fStack_b14 = auVar27._12_4_;
            local_be0 = auVar25._0_4_;
            fStack_bdc = auVar25._4_4_;
            fStack_bd8 = auVar25._8_4_;
            fStack_bd4 = auVar25._12_4_;
            local_bf0 = auVar26._0_4_;
            fStack_bec = auVar26._4_4_;
            fStack_be8 = auVar26._8_4_;
            fStack_be4 = auVar26._12_4_;
            local_b30 = auVar28._0_4_;
            fStack_b2c = auVar28._4_4_;
            fStack_b28 = auVar28._8_4_;
            fStack_b24 = auVar28._12_4_;
            if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar108 >> 0x7f,0) == '\0') &&
                  (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar108 >> 0xbf,0) == '\0') &&
                (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar108[0x1f]) break;
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar269 = vblendvps_avx(auVar149,local_6a0,auVar108);
            auVar109 = vshufps_avx(auVar269,auVar269,0xb1);
            auVar109 = vminps_avx(auVar269,auVar109);
            auVar144 = vshufpd_avx(auVar109,auVar109,5);
            auVar109 = vminps_avx(auVar109,auVar144);
            auVar144 = vperm2f128_avx(auVar109,auVar109,1);
            auVar109 = vminps_avx(auVar109,auVar144);
            auVar269 = vcmpps_avx(auVar269,auVar109,0);
            auVar109 = auVar108 & auVar269;
            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0x7f,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0xbf,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar109[0x1f] < '\0') {
              auVar108 = vandps_avx(auVar269,auVar108);
            }
            uVar81 = vmovmskps_avx(auVar108);
            uVar90 = 0;
            if (uVar81 != 0) {
              for (; (uVar81 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
              }
            }
            uVar84 = (ulong)uVar90;
            *(undefined4 *)(local_4e0 + uVar84 * 4) = 0;
            fVar327 = local_1a0[uVar84];
            uVar90 = *(uint *)(local_4c0 + uVar84 * 4);
            fVar329 = auVar24._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar329 = sqrtf((float)local_9c0._0_4_);
            }
            auVar265 = vminps_avx(auVar25,auVar27);
            auVar184 = vmaxps_avx(auVar25,auVar27);
            auVar187 = vminps_avx(auVar26,auVar28);
            auVar99 = vminps_avx(auVar265,auVar187);
            auVar265 = vmaxps_avx(auVar26,auVar28);
            auVar187 = vmaxps_avx(auVar184,auVar265);
            auVar180._8_4_ = 0x7fffffff;
            auVar180._0_8_ = 0x7fffffff7fffffff;
            auVar180._12_4_ = 0x7fffffff;
            auVar184 = vandps_avx(auVar99,auVar180);
            auVar265 = vandps_avx(auVar187,auVar180);
            auVar184 = vmaxps_avx(auVar184,auVar265);
            auVar265 = vmovshdup_avx(auVar184);
            auVar265 = vmaxss_avx(auVar265,auVar184);
            auVar184 = vshufpd_avx(auVar184,auVar184,1);
            auVar184 = vmaxss_avx(auVar184,auVar265);
            local_a00._0_4_ = auVar184._0_4_ * 1.9073486e-06;
            local_a80._0_4_ = fVar329 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar187,auVar187,0xff);
            auVar184 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar327),0x10);
            auVar275 = ZEXT1664(auVar184);
            lVar88 = 5;
            do {
              do {
                bVar91 = lVar88 == 0;
                lVar88 = lVar88 + -1;
                if (bVar91) goto LAB_008f904b;
                auVar265 = auVar275._0_16_;
                auVar184 = vmovshdup_avx(auVar265);
                fVar314 = auVar184._0_4_;
                fVar173 = 1.0 - fVar314;
                auVar184 = vshufps_avx(auVar265,auVar265,0x55);
                fVar327 = auVar184._0_4_;
                fVar329 = auVar184._4_4_;
                fVar331 = auVar184._8_4_;
                fVar172 = auVar184._12_4_;
                auVar184 = vshufps_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),0);
                fVar174 = auVar184._0_4_;
                fVar175 = auVar184._4_4_;
                fVar259 = auVar184._8_4_;
                fVar276 = auVar184._12_4_;
                fVar280 = local_bf0 * fVar327 + local_b20 * fVar174;
                fVar284 = fStack_bec * fVar329 + fStack_b1c * fVar175;
                fVar307 = fStack_be8 * fVar331 + fStack_b18 * fVar259;
                fVar313 = fStack_be4 * fVar172 + fStack_b14 * fVar276;
                auVar237._0_4_ =
                     fVar174 * (local_b20 * fVar327 + fVar174 * local_be0) + fVar327 * fVar280;
                auVar237._4_4_ =
                     fVar175 * (fStack_b1c * fVar329 + fVar175 * fStack_bdc) + fVar329 * fVar284;
                auVar237._8_4_ =
                     fVar259 * (fStack_b18 * fVar331 + fVar259 * fStack_bd8) + fVar331 * fVar307;
                auVar237._12_4_ =
                     fVar276 * (fStack_b14 * fVar172 + fVar276 * fStack_bd4) + fVar172 * fVar313;
                auVar181._0_4_ =
                     fVar174 * fVar280 + fVar327 * (fVar327 * local_b30 + local_bf0 * fVar174);
                auVar181._4_4_ =
                     fVar175 * fVar284 + fVar329 * (fVar329 * fStack_b2c + fStack_bec * fVar175);
                auVar181._8_4_ =
                     fVar259 * fVar307 + fVar331 * (fVar331 * fStack_b28 + fStack_be8 * fVar259);
                auVar181._12_4_ =
                     fVar276 * fVar313 + fVar172 * (fVar172 * fStack_b24 + fStack_be4 * fVar276);
                auVar184 = vshufps_avx(auVar265,auVar265,0);
                auVar132._0_4_ = auVar184._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar132._4_4_ = auVar184._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar132._8_4_ = auVar184._8_4_ * fStack_9a8 + 0.0;
                auVar132._12_4_ = auVar184._12_4_ * fStack_9a4 + 0.0;
                auVar98._0_4_ = fVar174 * auVar237._0_4_ + fVar327 * auVar181._0_4_;
                auVar98._4_4_ = fVar175 * auVar237._4_4_ + fVar329 * auVar181._4_4_;
                auVar98._8_4_ = fVar259 * auVar237._8_4_ + fVar331 * auVar181._8_4_;
                auVar98._12_4_ = fVar276 * auVar237._12_4_ + fVar172 * auVar181._12_4_;
                local_960._0_16_ = auVar98;
                auVar184 = vsubps_avx(auVar132,auVar98);
                _local_ae0 = auVar184;
                auVar184 = vdpps_avx(auVar184,auVar184,0x7f);
                fVar327 = auVar184._0_4_;
                if (fVar327 < 0.0) {
                  local_aa0._0_16_ = auVar181;
                  fVar329 = sqrtf(fVar327);
                  auVar275 = ZEXT1664(auVar265);
                  auVar181 = local_aa0._0_16_;
                }
                else {
                  auVar187 = vsqrtss_avx(auVar184,auVar184);
                  fVar329 = auVar187._0_4_;
                }
                auVar187 = vsubps_avx(auVar181,auVar237);
                auVar301._0_4_ = auVar187._0_4_ * 3.0;
                auVar301._4_4_ = auVar187._4_4_ * 3.0;
                auVar301._8_4_ = auVar187._8_4_ * 3.0;
                auVar301._12_4_ = auVar187._12_4_ * 3.0;
                auVar187 = vshufps_avx(ZEXT416((uint)(fVar314 * 6.0)),ZEXT416((uint)(fVar314 * 6.0))
                                       ,0);
                auVar99 = ZEXT416((uint)((fVar173 - (fVar314 + fVar314)) * 6.0));
                auVar161 = vshufps_avx(auVar99,auVar99,0);
                auVar99 = ZEXT416((uint)((fVar314 - (fVar173 + fVar173)) * 6.0));
                auVar93 = vshufps_avx(auVar99,auVar99,0);
                auVar94 = vshufps_avx(ZEXT416((uint)(fVar173 * 6.0)),ZEXT416((uint)(fVar173 * 6.0)),
                                      0);
                auVar99 = vdpps_avx(auVar301,auVar301,0x7f);
                auVar133._0_4_ =
                     auVar94._0_4_ * local_be0 +
                     auVar93._0_4_ * local_b20 +
                     auVar187._0_4_ * local_b30 + auVar161._0_4_ * local_bf0;
                auVar133._4_4_ =
                     auVar94._4_4_ * fStack_bdc +
                     auVar93._4_4_ * fStack_b1c +
                     auVar187._4_4_ * fStack_b2c + auVar161._4_4_ * fStack_bec;
                auVar133._8_4_ =
                     auVar94._8_4_ * fStack_bd8 +
                     auVar93._8_4_ * fStack_b18 +
                     auVar187._8_4_ * fStack_b28 + auVar161._8_4_ * fStack_be8;
                auVar133._12_4_ =
                     auVar94._12_4_ * fStack_bd4 +
                     auVar93._12_4_ * fStack_b14 +
                     auVar187._12_4_ * fStack_b24 + auVar161._12_4_ * fStack_be4;
                auVar187 = vblendps_avx(auVar99,_DAT_01f45a50,0xe);
                auVar161 = vrsqrtss_avx(auVar187,auVar187);
                fVar172 = auVar161._0_4_;
                fVar331 = auVar99._0_4_;
                auVar161 = vdpps_avx(auVar301,auVar133,0x7f);
                auVar93 = vshufps_avx(auVar99,auVar99,0);
                auVar134._0_4_ = auVar133._0_4_ * auVar93._0_4_;
                auVar134._4_4_ = auVar133._4_4_ * auVar93._4_4_;
                auVar134._8_4_ = auVar133._8_4_ * auVar93._8_4_;
                auVar134._12_4_ = auVar133._12_4_ * auVar93._12_4_;
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                auVar210._0_4_ = auVar301._0_4_ * auVar161._0_4_;
                auVar210._4_4_ = auVar301._4_4_ * auVar161._4_4_;
                auVar210._8_4_ = auVar301._8_4_ * auVar161._8_4_;
                auVar210._12_4_ = auVar301._12_4_ * auVar161._12_4_;
                auVar94 = vsubps_avx(auVar134,auVar210);
                auVar161 = vrcpss_avx(auVar187,auVar187);
                auVar187 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(auVar275._0_4_ * (float)local_a80._0_4_)));
                auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar331 * auVar161._0_4_)));
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                uVar84 = CONCAT44(auVar301._4_4_,auVar301._0_4_);
                auVar238._0_8_ = uVar84 ^ 0x8000000080000000;
                auVar238._8_4_ = -auVar301._8_4_;
                auVar238._12_4_ = -auVar301._12_4_;
                auVar93 = ZEXT416((uint)(fVar172 * 1.5 +
                                        fVar331 * -0.5 * fVar172 * fVar172 * fVar172));
                auVar93 = vshufps_avx(auVar93,auVar93,0);
                auVar182._0_4_ = auVar93._0_4_ * auVar94._0_4_ * auVar161._0_4_;
                auVar182._4_4_ = auVar93._4_4_ * auVar94._4_4_ * auVar161._4_4_;
                auVar182._8_4_ = auVar93._8_4_ * auVar94._8_4_ * auVar161._8_4_;
                auVar182._12_4_ = auVar93._12_4_ * auVar94._12_4_ * auVar161._12_4_;
                auVar266._0_4_ = auVar301._0_4_ * auVar93._0_4_;
                auVar266._4_4_ = auVar301._4_4_ * auVar93._4_4_;
                auVar266._8_4_ = auVar301._8_4_ * auVar93._8_4_;
                auVar266._12_4_ = auVar301._12_4_ * auVar93._12_4_;
                if (fVar331 < 0.0) {
                  local_aa0._0_16_ = auVar238;
                  local_920._0_16_ = auVar266;
                  local_9e0._0_16_ = auVar182;
                  fVar331 = sqrtf(fVar331);
                  auVar182 = local_9e0._0_16_;
                  auVar238 = local_aa0._0_16_;
                  auVar266 = local_920._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                  fVar331 = auVar99._0_4_;
                }
                auVar99 = vdpps_avx(_local_ae0,auVar266,0x7f);
                fVar329 = ((float)local_a00._0_4_ / fVar331) * (fVar329 + 1.0) +
                          auVar187._0_4_ + fVar329 * (float)local_a00._0_4_;
                auVar161 = vdpps_avx(auVar238,auVar266,0x7f);
                auVar93 = vdpps_avx(_local_ae0,auVar182,0x7f);
                auVar94 = vdpps_avx(_local_9b0,auVar266,0x7f);
                auVar95 = vdpps_avx(_local_ae0,auVar238,0x7f);
                fVar331 = auVar161._0_4_ + auVar93._0_4_;
                fVar172 = auVar99._0_4_;
                auVar100._0_4_ = fVar172 * fVar172;
                auVar100._4_4_ = auVar99._4_4_ * auVar99._4_4_;
                auVar100._8_4_ = auVar99._8_4_ * auVar99._8_4_;
                auVar100._12_4_ = auVar99._12_4_ * auVar99._12_4_;
                auVar93 = vsubps_avx(auVar184,auVar100);
                auVar161 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
                fVar173 = auVar95._0_4_ - fVar172 * fVar331;
                fVar174 = auVar161._0_4_ - fVar172 * auVar94._0_4_;
                auVar161 = vrsqrtss_avx(auVar93,auVar93);
                fVar175 = auVar93._0_4_;
                fVar172 = auVar161._0_4_;
                fVar172 = fVar172 * 1.5 + fVar175 * -0.5 * fVar172 * fVar172 * fVar172;
                if (fVar175 < 0.0) {
                  local_aa0._0_4_ = fVar329;
                  local_920._0_16_ = auVar94;
                  local_9e0._0_16_ = ZEXT416((uint)fVar331);
                  local_7a0._0_4_ = fVar173;
                  local_9a0._0_4_ = fVar174;
                  local_7c0._0_4_ = fVar172;
                  fVar175 = sqrtf(fVar175);
                  fVar172 = (float)local_7c0._0_4_;
                  fVar173 = (float)local_7a0._0_4_;
                  fVar174 = (float)local_9a0._0_4_;
                  auVar94 = local_920._0_16_;
                  fVar329 = (float)local_aa0._0_4_;
                  auVar161 = local_9e0._0_16_;
                }
                else {
                  auVar161 = vsqrtss_avx(auVar93,auVar93);
                  fVar175 = auVar161._0_4_;
                  auVar161 = ZEXT416((uint)fVar331);
                }
                auVar95 = vpermilps_avx(local_960._0_16_,0xff);
                auVar105 = vshufps_avx(auVar301,auVar301,0xff);
                fVar331 = fVar173 * fVar172 - auVar105._0_4_;
                auVar211._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
                auVar211._8_4_ = auVar94._8_4_ ^ 0x80000000;
                auVar211._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar239._0_4_ = -fVar331;
                auVar239._4_4_ = 0x80000000;
                auVar239._8_4_ = 0x80000000;
                auVar239._12_4_ = 0x80000000;
                auVar93 = vinsertps_avx(auVar239,ZEXT416((uint)(fVar174 * fVar172)),0x1c);
                auVar94 = vmovsldup_avx(ZEXT416((uint)(auVar161._0_4_ * fVar174 * fVar172 -
                                                      auVar94._0_4_ * fVar331)));
                auVar93 = vdivps_avx(auVar93,auVar94);
                auVar161 = vinsertps_avx(auVar161,auVar211,0x10);
                auVar161 = vdivps_avx(auVar161,auVar94);
                auVar94 = vmovsldup_avx(auVar99);
                auVar101 = ZEXT416((uint)(fVar175 - auVar95._0_4_));
                auVar95 = vmovsldup_avx(auVar101);
                auVar162._0_4_ = auVar94._0_4_ * auVar93._0_4_ + auVar95._0_4_ * auVar161._0_4_;
                auVar162._4_4_ = auVar94._4_4_ * auVar93._4_4_ + auVar95._4_4_ * auVar161._4_4_;
                auVar162._8_4_ = auVar94._8_4_ * auVar93._8_4_ + auVar95._8_4_ * auVar161._8_4_;
                auVar162._12_4_ = auVar94._12_4_ * auVar93._12_4_ + auVar95._12_4_ * auVar161._12_4_
                ;
                auVar161 = vsubps_avx(auVar265,auVar162);
                auVar275 = ZEXT1664(auVar161);
                auVar163._8_4_ = 0x7fffffff;
                auVar163._0_8_ = 0x7fffffff7fffffff;
                auVar163._12_4_ = 0x7fffffff;
                auVar265 = vandps_avx(auVar99,auVar163);
              } while (fVar329 <= auVar265._0_4_);
              auVar183._8_4_ = 0x7fffffff;
              auVar183._0_8_ = 0x7fffffff7fffffff;
              auVar183._12_4_ = 0x7fffffff;
              auVar265 = vandps_avx(auVar101,auVar183);
            } while ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar187._0_4_ + fVar329 <=
                     auVar265._0_4_);
            fVar329 = auVar161._0_4_ + (float)local_8f0._0_4_;
            if ((fVar320 <= fVar329) &&
               (fVar331 = *(float *)(ray + k * 4 + 0x80), fVar329 <= fVar331)) {
              auVar265 = vmovshdup_avx(auVar161);
              fVar172 = auVar265._0_4_;
              if ((0.0 <= fVar172) && (fVar172 <= 1.0)) {
                auVar184 = vrsqrtss_avx(auVar184,auVar184);
                fVar173 = auVar184._0_4_;
                pGVar10 = (context->scene->geometries).items[uVar86].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar184 = ZEXT416((uint)(fVar173 * 1.5 +
                                           fVar327 * -0.5 * fVar173 * fVar173 * fVar173));
                  auVar184 = vshufps_avx(auVar184,auVar184,0);
                  auVar185._0_4_ = auVar184._0_4_ * (float)local_ae0._0_4_;
                  auVar185._4_4_ = auVar184._4_4_ * (float)local_ae0._4_4_;
                  auVar185._8_4_ = auVar184._8_4_ * fStack_ad8;
                  auVar185._12_4_ = auVar184._12_4_ * fStack_ad4;
                  auVar135._0_4_ = auVar301._0_4_ + auVar105._0_4_ * auVar185._0_4_;
                  auVar135._4_4_ = auVar301._4_4_ + auVar105._4_4_ * auVar185._4_4_;
                  auVar135._8_4_ = auVar301._8_4_ + auVar105._8_4_ * auVar185._8_4_;
                  auVar135._12_4_ = auVar301._12_4_ + auVar105._12_4_ * auVar185._12_4_;
                  auVar184 = vshufps_avx(auVar185,auVar185,0xc9);
                  auVar265 = vshufps_avx(auVar301,auVar301,0xc9);
                  auVar186._0_4_ = auVar265._0_4_ * auVar185._0_4_;
                  auVar186._4_4_ = auVar265._4_4_ * auVar185._4_4_;
                  auVar186._8_4_ = auVar265._8_4_ * auVar185._8_4_;
                  auVar186._12_4_ = auVar265._12_4_ * auVar185._12_4_;
                  auVar212._0_4_ = auVar301._0_4_ * auVar184._0_4_;
                  auVar212._4_4_ = auVar301._4_4_ * auVar184._4_4_;
                  auVar212._8_4_ = auVar301._8_4_ * auVar184._8_4_;
                  auVar212._12_4_ = auVar301._12_4_ * auVar184._12_4_;
                  auVar187 = vsubps_avx(auVar212,auVar186);
                  auVar184 = vshufps_avx(auVar187,auVar187,0xc9);
                  auVar265 = vshufps_avx(auVar135,auVar135,0xc9);
                  auVar213._0_4_ = auVar265._0_4_ * auVar184._0_4_;
                  auVar213._4_4_ = auVar265._4_4_ * auVar184._4_4_;
                  auVar213._8_4_ = auVar265._8_4_ * auVar184._8_4_;
                  auVar213._12_4_ = auVar265._12_4_ * auVar184._12_4_;
                  auVar184 = vshufps_avx(auVar187,auVar187,0xd2);
                  auVar136._0_4_ = auVar135._0_4_ * auVar184._0_4_;
                  auVar136._4_4_ = auVar135._4_4_ * auVar184._4_4_;
                  auVar136._8_4_ = auVar135._8_4_ * auVar184._8_4_;
                  auVar136._12_4_ = auVar135._12_4_ * auVar184._12_4_;
                  auVar184 = vsubps_avx(auVar213,auVar136);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar329;
                    uVar89 = vextractps_avx(auVar184,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar89;
                    uVar89 = vextractps_avx(auVar184,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar89;
                    *(int *)(ray + k * 4 + 0xe0) = auVar184._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar172;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar86;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar161,auVar161,0x55);
                    auVar265 = vshufps_avx(auVar184,auVar184,0x55);
                    auStack_750 = vshufps_avx(auVar184,auVar184,0xaa);
                    local_740 = vshufps_avx(auVar184,auVar184,0);
                    local_760 = (RTCHitN  [16])auVar265;
                    local_720 = ZEXT816(0) << 0x20;
                    local_710 = local_780._0_8_;
                    uStack_708 = local_780._8_8_;
                    local_700 = local_770;
                    vcmpps_avx(ZEXT1632(local_770),ZEXT1632(local_770),0xf);
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uVar90 = context->user->instPrimID[0];
                    auVar137._4_4_ = uVar90;
                    auVar137._0_4_ = uVar90;
                    auVar137._8_4_ = uVar90;
                    auVar137._12_4_ = uVar90;
                    auStack_6e0 = auVar137;
                    *(float *)(ray + k * 4 + 0x80) = fVar329;
                    local_860._0_16_ = *local_a48;
                    local_b10.valid = (int *)local_860;
                    local_b10.geometryUserPtr = pGVar10->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_760;
                    local_b10.N = 4;
                    auVar184 = *local_a48;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar10->intersectionFilterN)(&local_b10);
                      auVar386._8_56_ = extraout_var;
                      auVar386._0_8_ = extraout_XMM1_Qa;
                      auVar137 = auVar386._0_16_;
                      auVar184 = local_860._0_16_;
                    }
                    if (auVar184 == (undefined1  [16])0x0) {
                      auVar265 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar184 = vpcmpeqd_avx(auVar137,auVar137);
                      auVar265 = auVar265 ^ auVar184;
                    }
                    else {
                      p_Var15 = context->args->filter;
                      auVar187 = vpcmpeqd_avx(auVar265,auVar265);
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_b10);
                        auVar187 = vpcmpeqd_avx(auVar187,auVar187);
                        auVar184 = local_860._0_16_;
                      }
                      auVar99 = vpcmpeqd_avx(auVar184,_DAT_01f45a50);
                      auVar265 = auVar99 ^ auVar187;
                      if (auVar184 != (undefined1  [16])0x0) {
                        auVar99 = auVar99 ^ auVar187;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar184;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar184;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar184;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar184;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar184;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar184;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar184;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar184;
                        auVar184 = vmaskmovps_avx(auVar99,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar184;
                      }
                    }
                    auVar102._8_8_ = 0x100000001;
                    auVar102._0_8_ = 0x100000001;
                    if ((auVar102 & auVar265) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar331;
                    }
                  }
                }
              }
            }
LAB_008f904b:
            uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar311._4_4_ = uVar89;
            auVar311._0_4_ = uVar89;
            auVar311._8_4_ = uVar89;
            auVar311._12_4_ = uVar89;
            auVar311._16_4_ = uVar89;
            auVar311._20_4_ = uVar89;
            auVar311._24_4_ = uVar89;
            auVar311._28_4_ = uVar89;
            auVar386 = ZEXT3264(auVar311);
            auVar108 = vcmpps_avx(_local_820,auVar311,2);
            auVar108 = vandps_avx(auVar108,local_4e0);
          }
          auVar117._0_4_ = (float)local_8a0._0_4_ + (float)local_800._0_4_;
          auVar117._4_4_ = (float)local_8a0._4_4_ + (float)local_800._4_4_;
          auVar117._8_4_ = fStack_898 + fStack_7f8;
          auVar117._12_4_ = fStack_894 + fStack_7f4;
          auVar117._16_4_ = fStack_890 + fStack_7f0;
          auVar117._20_4_ = fStack_88c + fStack_7ec;
          auVar117._24_4_ = fStack_888 + fStack_7e8;
          auVar117._28_4_ = fStack_884 + fStack_7e4;
          auVar184 = vshufps_avx(auVar386._0_16_,auVar386._0_16_,0);
          auVar150._16_16_ = auVar184;
          auVar150._0_16_ = auVar184;
          auVar108 = vcmpps_avx(auVar117,auVar150,2);
          _local_820 = vandps_avx(auVar108,local_840);
          auVar118._8_4_ = 3;
          auVar118._0_8_ = 0x300000003;
          auVar118._12_4_ = 3;
          auVar118._16_4_ = 3;
          auVar118._20_4_ = 3;
          auVar118._24_4_ = 3;
          auVar118._28_4_ = 3;
          auVar151._8_4_ = 2;
          auVar151._0_8_ = 0x200000002;
          auVar151._12_4_ = 2;
          auVar151._16_4_ = 2;
          auVar151._20_4_ = 2;
          auVar151._24_4_ = 2;
          auVar151._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar151,auVar118,_local_640);
          auVar184 = vpcmpgtd_avx(auVar108._16_16_,local_6c0._0_16_);
          auVar265 = vpshufd_avx(local_660._0_16_,0);
          auVar265 = vpcmpgtd_avx(auVar108._0_16_,auVar265);
          auVar152._16_16_ = auVar184;
          auVar152._0_16_ = auVar265;
          local_840 = vblendps_avx(ZEXT1632(auVar265),auVar152,0xf0);
          local_860 = vandnps_avx(local_840,_local_820);
          local_6a0 = _local_480;
          local_800._4_4_ = (float)local_8a0._4_4_ + (float)local_480._4_4_;
          local_800._0_4_ = (float)local_8a0._0_4_ + (float)local_480._0_4_;
          fStack_7f8 = fStack_898 + fStack_478;
          fStack_7f4 = fStack_894 + fStack_474;
          fStack_7f0 = fStack_890 + fStack_470;
          fStack_7ec = fStack_88c + fStack_46c;
          fStack_7e8 = fStack_888 + fStack_468;
          fStack_7e4 = fStack_884 + fStack_464;
          auVar355 = ZEXT3264(local_ac0);
          auVar275 = ZEXT3264(local_980);
          fVar327 = (float)local_a40._0_4_;
          fVar329 = (float)local_a40._4_4_;
          fVar331 = fStack_a38;
          fVar172 = fStack_a34;
          fVar173 = fStack_a30;
          fVar174 = fStack_a2c;
          fVar175 = fStack_a28;
          for (; (((((((local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_860 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_860 >> 0x7f,0) != '\0') ||
                   (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_860 >> 0xbf,0) != '\0') ||
                 (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_860[0x1f] < '\0'; local_860 = vandps_avx(auVar108,local_860)) {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar108 = vblendvps_avx(auVar153,local_6a0,local_860);
            auVar269 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar269 = vminps_avx(auVar108,auVar269);
            auVar109 = vshufpd_avx(auVar269,auVar269,5);
            auVar269 = vminps_avx(auVar269,auVar109);
            auVar109 = vperm2f128_avx(auVar269,auVar269,1);
            auVar269 = vminps_avx(auVar269,auVar109);
            auVar269 = vcmpps_avx(auVar108,auVar269,0);
            auVar109 = local_860 & auVar269;
            auVar108 = local_860;
            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0x7f,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0xbf,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar109[0x1f] < '\0') {
              auVar108 = vandps_avx(auVar269,local_860);
            }
            uVar81 = vmovmskps_avx(auVar108);
            uVar90 = 0;
            if (uVar81 != 0) {
              for (; (uVar81 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
              }
            }
            uVar84 = (ulong)uVar90;
            *(undefined4 *)(local_860 + uVar84 * 4) = 0;
            fVar259 = local_1c0[uVar84];
            uVar90 = *(uint *)(local_460 + uVar84 * 4);
            fVar276 = auVar130._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar276 = sqrtf((float)local_9c0._0_4_);
              auVar275 = ZEXT3264(local_980);
              auVar355 = ZEXT3264(local_ac0);
              fVar327 = (float)local_a40._0_4_;
              fVar329 = (float)local_a40._4_4_;
              fVar331 = fStack_a38;
              fVar172 = fStack_a34;
              fVar173 = fStack_a30;
              fVar174 = fStack_a2c;
              fVar175 = fStack_a28;
            }
            auVar265 = vminps_avx(auVar25,auVar27);
            auVar184 = vmaxps_avx(auVar25,auVar27);
            auVar187 = vminps_avx(auVar26,auVar28);
            auVar99 = vminps_avx(auVar265,auVar187);
            auVar265 = vmaxps_avx(auVar26,auVar28);
            auVar187 = vmaxps_avx(auVar184,auVar265);
            auVar188._8_4_ = 0x7fffffff;
            auVar188._0_8_ = 0x7fffffff7fffffff;
            auVar188._12_4_ = 0x7fffffff;
            auVar184 = vandps_avx(auVar99,auVar188);
            auVar265 = vandps_avx(auVar187,auVar188);
            auVar184 = vmaxps_avx(auVar184,auVar265);
            auVar265 = vmovshdup_avx(auVar184);
            auVar265 = vmaxss_avx(auVar265,auVar184);
            auVar184 = vshufpd_avx(auVar184,auVar184,1);
            auVar184 = vmaxss_avx(auVar184,auVar265);
            local_a00._0_4_ = auVar184._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar276 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar187,auVar187,0xff);
            auVar184 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar259),0x10);
            auVar386 = ZEXT1664(auVar184);
            lVar88 = 5;
            do {
              do {
                bVar91 = lVar88 == 0;
                lVar88 = lVar88 + -1;
                if (bVar91) goto LAB_008f9bb8;
                auVar265 = auVar386._0_16_;
                auVar184 = vmovshdup_avx(auVar265);
                fVar314 = auVar184._0_4_;
                fVar173 = 1.0 - fVar314;
                auVar184 = vshufps_avx(auVar265,auVar265,0x55);
                fVar327 = auVar184._0_4_;
                fVar329 = auVar184._4_4_;
                fVar331 = auVar184._8_4_;
                fVar172 = auVar184._12_4_;
                auVar184 = vshufps_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),0);
                fVar174 = auVar184._0_4_;
                fVar175 = auVar184._4_4_;
                fVar259 = auVar184._8_4_;
                fVar276 = auVar184._12_4_;
                fVar280 = local_bf0 * fVar327 + local_b20 * fVar174;
                fVar284 = fStack_bec * fVar329 + fStack_b1c * fVar175;
                fVar307 = fStack_be8 * fVar331 + fStack_b18 * fVar259;
                fVar313 = fStack_be4 * fVar172 + fStack_b14 * fVar276;
                auVar240._0_4_ =
                     fVar174 * (local_b20 * fVar327 + fVar174 * local_be0) + fVar327 * fVar280;
                auVar240._4_4_ =
                     fVar175 * (fStack_b1c * fVar329 + fVar175 * fStack_bdc) + fVar329 * fVar284;
                auVar240._8_4_ =
                     fVar259 * (fStack_b18 * fVar331 + fVar259 * fStack_bd8) + fVar331 * fVar307;
                auVar240._12_4_ =
                     fVar276 * (fStack_b14 * fVar172 + fVar276 * fStack_bd4) + fVar172 * fVar313;
                auVar189._0_4_ =
                     fVar174 * fVar280 + fVar327 * (fVar327 * local_b30 + local_bf0 * fVar174);
                auVar189._4_4_ =
                     fVar175 * fVar284 + fVar329 * (fVar329 * fStack_b2c + fStack_bec * fVar175);
                auVar189._8_4_ =
                     fVar259 * fVar307 + fVar331 * (fVar331 * fStack_b28 + fStack_be8 * fVar259);
                auVar189._12_4_ =
                     fVar276 * fVar313 + fVar172 * (fVar172 * fStack_b24 + fStack_be4 * fVar276);
                auVar184 = vshufps_avx(auVar265,auVar265,0);
                auVar138._0_4_ = auVar184._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar138._4_4_ = auVar184._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar138._8_4_ = auVar184._8_4_ * fStack_9a8 + 0.0;
                auVar138._12_4_ = auVar184._12_4_ * fStack_9a4 + 0.0;
                auVar103._0_4_ = fVar174 * auVar240._0_4_ + fVar327 * auVar189._0_4_;
                auVar103._4_4_ = fVar175 * auVar240._4_4_ + fVar329 * auVar189._4_4_;
                auVar103._8_4_ = fVar259 * auVar240._8_4_ + fVar331 * auVar189._8_4_;
                auVar103._12_4_ = fVar276 * auVar240._12_4_ + fVar172 * auVar189._12_4_;
                local_960._0_16_ = auVar103;
                auVar184 = vsubps_avx(auVar138,auVar103);
                _local_ae0 = auVar184;
                auVar184 = vdpps_avx(auVar184,auVar184,0x7f);
                fVar259 = auVar184._0_4_;
                if (fVar259 < 0.0) {
                  local_a80._0_16_ = auVar240;
                  fVar327 = sqrtf(fVar259);
                  auVar386 = ZEXT1664(auVar265);
                  auVar240 = local_a80._0_16_;
                }
                else {
                  auVar187 = vsqrtss_avx(auVar184,auVar184);
                  fVar327 = auVar187._0_4_;
                }
                auVar187 = vsubps_avx(auVar189,auVar240);
                auVar267._0_4_ = auVar187._0_4_ * 3.0;
                auVar267._4_4_ = auVar187._4_4_ * 3.0;
                auVar267._8_4_ = auVar187._8_4_ * 3.0;
                auVar267._12_4_ = auVar187._12_4_ * 3.0;
                auVar187 = vshufps_avx(ZEXT416((uint)(fVar314 * 6.0)),ZEXT416((uint)(fVar314 * 6.0))
                                       ,0);
                auVar99 = ZEXT416((uint)((fVar173 - (fVar314 + fVar314)) * 6.0));
                auVar161 = vshufps_avx(auVar99,auVar99,0);
                auVar99 = ZEXT416((uint)((fVar314 - (fVar173 + fVar173)) * 6.0));
                auVar93 = vshufps_avx(auVar99,auVar99,0);
                auVar94 = vshufps_avx(ZEXT416((uint)(fVar173 * 6.0)),ZEXT416((uint)(fVar173 * 6.0)),
                                      0);
                auVar99 = vdpps_avx(auVar267,auVar267,0x7f);
                auVar139._0_4_ =
                     auVar94._0_4_ * local_be0 +
                     auVar93._0_4_ * local_b20 +
                     auVar187._0_4_ * local_b30 + auVar161._0_4_ * local_bf0;
                auVar139._4_4_ =
                     auVar94._4_4_ * fStack_bdc +
                     auVar93._4_4_ * fStack_b1c +
                     auVar187._4_4_ * fStack_b2c + auVar161._4_4_ * fStack_bec;
                auVar139._8_4_ =
                     auVar94._8_4_ * fStack_bd8 +
                     auVar93._8_4_ * fStack_b18 +
                     auVar187._8_4_ * fStack_b28 + auVar161._8_4_ * fStack_be8;
                auVar139._12_4_ =
                     auVar94._12_4_ * fStack_bd4 +
                     auVar93._12_4_ * fStack_b14 +
                     auVar187._12_4_ * fStack_b24 + auVar161._12_4_ * fStack_be4;
                auVar187 = vblendps_avx(auVar99,_DAT_01f45a50,0xe);
                auVar161 = vrsqrtss_avx(auVar187,auVar187);
                fVar331 = auVar161._0_4_;
                fVar329 = auVar99._0_4_;
                auVar161 = vdpps_avx(auVar267,auVar139,0x7f);
                auVar93 = vshufps_avx(auVar99,auVar99,0);
                auVar140._0_4_ = auVar139._0_4_ * auVar93._0_4_;
                auVar140._4_4_ = auVar139._4_4_ * auVar93._4_4_;
                auVar140._8_4_ = auVar139._8_4_ * auVar93._8_4_;
                auVar140._12_4_ = auVar139._12_4_ * auVar93._12_4_;
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                auVar214._0_4_ = auVar267._0_4_ * auVar161._0_4_;
                auVar214._4_4_ = auVar267._4_4_ * auVar161._4_4_;
                auVar214._8_4_ = auVar267._8_4_ * auVar161._8_4_;
                auVar214._12_4_ = auVar267._12_4_ * auVar161._12_4_;
                auVar94 = vsubps_avx(auVar140,auVar214);
                auVar161 = vrcpss_avx(auVar187,auVar187);
                auVar187 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(auVar386._0_4_ * (float)local_920._0_4_)));
                auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar329 * auVar161._0_4_)));
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                uVar84 = CONCAT44(auVar267._4_4_,auVar267._0_4_);
                auVar309._0_8_ = uVar84 ^ 0x8000000080000000;
                auVar309._8_4_ = -auVar267._8_4_;
                auVar309._12_4_ = -auVar267._12_4_;
                auVar93 = ZEXT416((uint)(fVar331 * 1.5 +
                                        fVar329 * -0.5 * fVar331 * fVar331 * fVar331));
                auVar93 = vshufps_avx(auVar93,auVar93,0);
                auVar190._0_4_ = auVar93._0_4_ * auVar94._0_4_ * auVar161._0_4_;
                auVar190._4_4_ = auVar93._4_4_ * auVar94._4_4_ * auVar161._4_4_;
                auVar190._8_4_ = auVar93._8_4_ * auVar94._8_4_ * auVar161._8_4_;
                auVar190._12_4_ = auVar93._12_4_ * auVar94._12_4_ * auVar161._12_4_;
                local_aa0._0_4_ = auVar267._0_4_ * auVar93._0_4_;
                local_aa0._4_4_ = auVar267._4_4_ * auVar93._4_4_;
                local_aa0._8_4_ = auVar267._8_4_ * auVar93._8_4_;
                local_aa0._12_4_ = auVar267._12_4_ * auVar93._12_4_;
                if (fVar329 < 0.0) {
                  local_a80._0_4_ = fVar327;
                  local_9e0._0_16_ = auVar190;
                  fVar329 = sqrtf(fVar329);
                  auVar190 = local_9e0._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                  fVar329 = auVar99._0_4_;
                  local_a80._0_4_ = fVar327;
                }
                auVar99 = vdpps_avx(_local_ae0,local_aa0._0_16_,0x7f);
                fVar276 = ((float)local_a00._0_4_ / fVar329) * ((float)local_a80._0_4_ + 1.0) +
                          auVar187._0_4_ + (float)local_a80._0_4_ * (float)local_a00._0_4_;
                auVar161 = vdpps_avx(auVar309,local_aa0._0_16_,0x7f);
                auVar93 = vdpps_avx(_local_ae0,auVar190,0x7f);
                auVar94 = vdpps_avx(_local_9b0,local_aa0._0_16_,0x7f);
                auVar95 = vdpps_avx(_local_ae0,auVar309,0x7f);
                fVar327 = auVar161._0_4_ + auVar93._0_4_;
                fVar329 = auVar99._0_4_;
                auVar104._0_4_ = fVar329 * fVar329;
                auVar104._4_4_ = auVar99._4_4_ * auVar99._4_4_;
                auVar104._8_4_ = auVar99._8_4_ * auVar99._8_4_;
                auVar104._12_4_ = auVar99._12_4_ * auVar99._12_4_;
                auVar93 = vsubps_avx(auVar184,auVar104);
                local_aa0._0_16_ = ZEXT416((uint)fVar327);
                auVar161 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
                fVar331 = auVar95._0_4_ - fVar329 * fVar327;
                local_a80._0_16_ = auVar99;
                fVar329 = auVar161._0_4_ - fVar329 * auVar94._0_4_;
                auVar99 = vrsqrtss_avx(auVar93,auVar93);
                fVar172 = auVar93._0_4_;
                fVar327 = auVar99._0_4_;
                fVar327 = fVar327 * 1.5 + fVar172 * -0.5 * fVar327 * fVar327 * fVar327;
                if (fVar172 < 0.0) {
                  local_9e0._0_16_ = auVar94;
                  local_7a0._0_4_ = fVar331;
                  local_9a0._0_4_ = fVar329;
                  local_7c0._0_4_ = fVar327;
                  fVar172 = sqrtf(fVar172);
                  fVar327 = (float)local_7c0._0_4_;
                  fVar331 = (float)local_7a0._0_4_;
                  fVar329 = (float)local_9a0._0_4_;
                  auVar94 = local_9e0._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar93,auVar93);
                  fVar172 = auVar99._0_4_;
                }
                auVar355 = ZEXT3264(local_ac0);
                auVar105 = vpermilps_avx(local_960._0_16_,0xff);
                auVar95 = vshufps_avx(auVar267,auVar267,0xff);
                fVar331 = fVar331 * fVar327 - auVar95._0_4_;
                auVar215._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
                auVar215._8_4_ = auVar94._8_4_ ^ 0x80000000;
                auVar215._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar241._0_4_ = -fVar331;
                auVar241._4_4_ = 0x80000000;
                auVar241._8_4_ = 0x80000000;
                auVar241._12_4_ = 0x80000000;
                auVar99 = vinsertps_avx(auVar241,ZEXT416((uint)(fVar329 * fVar327)),0x1c);
                auVar93 = vmovsldup_avx(ZEXT416((uint)(local_aa0._0_4_ * fVar329 * fVar327 -
                                                      auVar94._0_4_ * fVar331)));
                auVar99 = vdivps_avx(auVar99,auVar93);
                auVar161 = vinsertps_avx(local_aa0._0_16_,auVar215,0x10);
                auVar161 = vdivps_avx(auVar161,auVar93);
                auVar93 = vmovsldup_avx(local_a80._0_16_);
                auVar105 = ZEXT416((uint)(fVar172 - auVar105._0_4_));
                auVar94 = vmovsldup_avx(auVar105);
                auVar164._0_4_ = auVar93._0_4_ * auVar99._0_4_ + auVar94._0_4_ * auVar161._0_4_;
                auVar164._4_4_ = auVar93._4_4_ * auVar99._4_4_ + auVar94._4_4_ * auVar161._4_4_;
                auVar164._8_4_ = auVar93._8_4_ * auVar99._8_4_ + auVar94._8_4_ * auVar161._8_4_;
                auVar164._12_4_ = auVar93._12_4_ * auVar99._12_4_ + auVar94._12_4_ * auVar161._12_4_
                ;
                auVar99 = vsubps_avx(auVar265,auVar164);
                auVar386 = ZEXT1664(auVar99);
                auVar165._8_4_ = 0x7fffffff;
                auVar165._0_8_ = 0x7fffffff7fffffff;
                auVar165._12_4_ = 0x7fffffff;
                auVar265 = vandps_avx(local_a80._0_16_,auVar165);
                auVar275 = ZEXT3264(local_980);
                fVar327 = (float)local_a40._0_4_;
                fVar329 = (float)local_a40._4_4_;
                fVar331 = fStack_a38;
                fVar172 = fStack_a34;
                fVar173 = fStack_a30;
                fVar174 = fStack_a2c;
                fVar175 = fStack_a28;
              } while (fVar276 <= auVar265._0_4_);
              auVar191._8_4_ = 0x7fffffff;
              auVar191._0_8_ = 0x7fffffff7fffffff;
              auVar191._12_4_ = 0x7fffffff;
              auVar265 = vandps_avx(auVar105,auVar191);
            } while ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar187._0_4_ + fVar276 <=
                     auVar265._0_4_);
            fVar276 = auVar99._0_4_ + (float)local_8f0._0_4_;
            if ((fVar320 <= fVar276) &&
               (fVar280 = *(float *)(ray + k * 4 + 0x80), fVar276 <= fVar280)) {
              auVar265 = vmovshdup_avx(auVar99);
              fVar284 = auVar265._0_4_;
              if ((0.0 <= fVar284) && (fVar284 <= 1.0)) {
                auVar184 = vrsqrtss_avx(auVar184,auVar184);
                fVar307 = auVar184._0_4_;
                pGVar10 = (context->scene->geometries).items[uVar86].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar184 = ZEXT416((uint)(fVar307 * 1.5 +
                                           fVar259 * -0.5 * fVar307 * fVar307 * fVar307));
                  auVar184 = vshufps_avx(auVar184,auVar184,0);
                  auVar192._0_4_ = auVar184._0_4_ * (float)local_ae0._0_4_;
                  auVar192._4_4_ = auVar184._4_4_ * (float)local_ae0._4_4_;
                  auVar192._8_4_ = auVar184._8_4_ * fStack_ad8;
                  auVar192._12_4_ = auVar184._12_4_ * fStack_ad4;
                  auVar141._0_4_ = auVar267._0_4_ + auVar95._0_4_ * auVar192._0_4_;
                  auVar141._4_4_ = auVar267._4_4_ + auVar95._4_4_ * auVar192._4_4_;
                  auVar141._8_4_ = auVar267._8_4_ + auVar95._8_4_ * auVar192._8_4_;
                  auVar141._12_4_ = auVar267._12_4_ + auVar95._12_4_ * auVar192._12_4_;
                  auVar184 = vshufps_avx(auVar192,auVar192,0xc9);
                  auVar265 = vshufps_avx(auVar267,auVar267,0xc9);
                  auVar193._0_4_ = auVar265._0_4_ * auVar192._0_4_;
                  auVar193._4_4_ = auVar265._4_4_ * auVar192._4_4_;
                  auVar193._8_4_ = auVar265._8_4_ * auVar192._8_4_;
                  auVar193._12_4_ = auVar265._12_4_ * auVar192._12_4_;
                  auVar216._0_4_ = auVar267._0_4_ * auVar184._0_4_;
                  auVar216._4_4_ = auVar267._4_4_ * auVar184._4_4_;
                  auVar216._8_4_ = auVar267._8_4_ * auVar184._8_4_;
                  auVar216._12_4_ = auVar267._12_4_ * auVar184._12_4_;
                  auVar187 = vsubps_avx(auVar216,auVar193);
                  auVar184 = vshufps_avx(auVar187,auVar187,0xc9);
                  auVar265 = vshufps_avx(auVar141,auVar141,0xc9);
                  auVar217._0_4_ = auVar265._0_4_ * auVar184._0_4_;
                  auVar217._4_4_ = auVar265._4_4_ * auVar184._4_4_;
                  auVar217._8_4_ = auVar265._8_4_ * auVar184._8_4_;
                  auVar217._12_4_ = auVar265._12_4_ * auVar184._12_4_;
                  auVar184 = vshufps_avx(auVar187,auVar187,0xd2);
                  auVar142._0_4_ = auVar141._0_4_ * auVar184._0_4_;
                  auVar142._4_4_ = auVar141._4_4_ * auVar184._4_4_;
                  auVar142._8_4_ = auVar141._8_4_ * auVar184._8_4_;
                  auVar142._12_4_ = auVar141._12_4_ * auVar184._12_4_;
                  auVar184 = vsubps_avx(auVar217,auVar142);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar276;
                    uVar89 = vextractps_avx(auVar184,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar89;
                    uVar89 = vextractps_avx(auVar184,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar89;
                    *(int *)(ray + k * 4 + 0xe0) = auVar184._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar284;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar86;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar99,auVar99,0x55);
                    auVar265 = vshufps_avx(auVar184,auVar184,0x55);
                    auStack_750 = vshufps_avx(auVar184,auVar184,0xaa);
                    local_740 = vshufps_avx(auVar184,auVar184,0);
                    local_760 = (RTCHitN  [16])auVar265;
                    local_720 = ZEXT816(0) << 0x20;
                    local_710 = local_780._0_8_;
                    uStack_708 = local_780._8_8_;
                    local_700 = local_770;
                    vcmpps_avx(ZEXT1632(local_770),ZEXT1632(local_770),0xf);
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uVar90 = context->user->instPrimID[0];
                    auVar143._4_4_ = uVar90;
                    auVar143._0_4_ = uVar90;
                    auVar143._8_4_ = uVar90;
                    auVar143._12_4_ = uVar90;
                    auStack_6e0 = auVar143;
                    *(float *)(ray + k * 4 + 0x80) = fVar276;
                    local_8e0 = *local_a48;
                    local_b10.valid = (int *)local_8e0;
                    local_b10.geometryUserPtr = pGVar10->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_760;
                    local_b10.N = 4;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar10->intersectionFilterN)(&local_b10);
                      auVar275._8_56_ = extraout_var_00;
                      auVar275._0_8_ = extraout_XMM1_Qa_00;
                      auVar143 = auVar275._0_16_;
                      auVar275 = ZEXT3264(local_980);
                      auVar355 = ZEXT3264(local_ac0);
                    }
                    fVar327 = (float)local_a40._0_4_;
                    fVar329 = (float)local_a40._4_4_;
                    fVar331 = fStack_a38;
                    fVar172 = fStack_a34;
                    fVar173 = fStack_a30;
                    fVar174 = fStack_a2c;
                    fVar175 = fStack_a28;
                    if (local_8e0 == (undefined1  [16])0x0) {
                      auVar184 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar265 = vpcmpeqd_avx(auVar143,auVar143);
                      auVar184 = auVar184 ^ auVar265;
                    }
                    else {
                      p_Var15 = context->args->filter;
                      auVar265 = vpcmpeqd_avx(auVar265,auVar265);
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_b10);
                        auVar275 = ZEXT3264(local_980);
                        auVar355 = ZEXT3264(local_ac0);
                        auVar265 = vpcmpeqd_avx(auVar265,auVar265);
                        fVar327 = (float)local_a40._0_4_;
                        fVar329 = (float)local_a40._4_4_;
                        fVar331 = fStack_a38;
                        fVar172 = fStack_a34;
                        fVar173 = fStack_a30;
                        fVar174 = fStack_a2c;
                        fVar175 = fStack_a28;
                      }
                      auVar187 = vpcmpeqd_avx(local_8e0,_DAT_01f45a50);
                      auVar184 = auVar187 ^ auVar265;
                      if (local_8e0 != (undefined1  [16])0x0) {
                        auVar187 = auVar187 ^ auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar265;
                        auVar265 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar265;
                      }
                    }
                    auVar106._8_8_ = 0x100000001;
                    auVar106._0_8_ = 0x100000001;
                    if ((auVar106 & auVar184) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar280;
                    }
                  }
                }
              }
            }
LAB_008f9bb8:
            uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar312._4_4_ = uVar89;
            auVar312._0_4_ = uVar89;
            auVar312._8_4_ = uVar89;
            auVar312._12_4_ = uVar89;
            auVar312._16_4_ = uVar89;
            auVar312._20_4_ = uVar89;
            auVar312._24_4_ = uVar89;
            auVar312._28_4_ = uVar89;
            auVar386 = ZEXT3264(auVar312);
            auVar108 = vcmpps_avx(_local_800,auVar312,2);
          }
          auVar108 = vandps_avx(local_620,local_600);
          auVar269 = vandps_avx(local_840,_local_820);
          auVar170._0_4_ = (float)local_8a0._0_4_ + local_4c0._0_4_;
          auVar170._4_4_ = (float)local_8a0._4_4_ + local_4c0._4_4_;
          auVar170._8_4_ = fStack_898 + local_4c0._8_4_;
          auVar170._12_4_ = fStack_894 + local_4c0._12_4_;
          auVar170._16_4_ = fStack_890 + local_4c0._16_4_;
          auVar170._20_4_ = fStack_88c + local_4c0._20_4_;
          auVar170._24_4_ = fStack_888 + local_4c0._24_4_;
          auVar170._28_4_ = fStack_884 + local_4c0._28_4_;
          auVar184 = vshufps_avx(auVar386._0_16_,auVar386._0_16_,0);
          auVar226._16_16_ = auVar184;
          auVar226._0_16_ = auVar184;
          auVar109 = vcmpps_avx(auVar170,auVar226,2);
          auVar108 = vandps_avx(auVar109,auVar108);
          auVar251._0_4_ = (float)local_8a0._0_4_ + local_480._0_4_;
          auVar251._4_4_ = (float)local_8a0._4_4_ + local_480._4_4_;
          auVar251._8_4_ = fStack_898 + local_480._8_4_;
          auVar251._12_4_ = fStack_894 + local_480._12_4_;
          auVar251._16_4_ = fStack_890 + local_480._16_4_;
          auVar251._20_4_ = fStack_88c + local_480._20_4_;
          auVar251._24_4_ = fStack_888 + local_480._24_4_;
          auVar251._28_4_ = fStack_884 + local_480._28_4_;
          auVar109 = vcmpps_avx(auVar251,auVar226,2);
          auVar269 = vandps_avx(auVar109,auVar269);
          auVar269 = vorps_avx(auVar108,auVar269);
          if ((((((((auVar269 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar269 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar269 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar269 >> 0x7f,0) != '\0') ||
                (auVar269 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar269 >> 0xbf,0) != '\0') ||
              (auVar269 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar269[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar83 * 0x60) = auVar269;
            auVar108 = vblendvps_avx(_local_480,_local_4c0,auVar108);
            *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x60) = auVar108;
            uVar84 = vmovlps_avx(local_5d0);
            (&uStack_140)[uVar83 * 0xc] = uVar84;
            auStack_138[uVar83 * 0x18] = local_c48 + 1;
            uVar83 = (ulong)((int)uVar83 + 1);
          }
          auVar386 = ZEXT3264(local_940);
          fVar262 = (float)local_8a0._0_4_;
          fVar279 = (float)local_8a0._4_4_;
          fVar283 = fStack_898;
          fVar287 = fStack_894;
          fVar290 = fStack_890;
          fVar293 = fStack_88c;
          fVar296 = fStack_888;
          fVar316 = fStack_884;
          goto LAB_008f8643;
        }
      }
      auVar386 = ZEXT3264(local_940);
      auVar355 = ZEXT3264(local_ac0);
      auVar275 = ZEXT3264(local_980);
    }
LAB_008f8643:
    while( true ) {
      auVar269 = local_580;
      uVar90 = (uint)uVar83;
      if (uVar90 == 0) {
        uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar107._4_4_ = uVar89;
        auVar107._0_4_ = uVar89;
        auVar107._8_4_ = uVar89;
        auVar107._12_4_ = uVar89;
        auVar184 = vcmpps_avx(local_5e0,auVar107,2);
        uVar86 = vmovmskps_avx(auVar184);
        uVar82 = (ulong)((uint)uVar82 - 1 & (uint)uVar82 & uVar86);
        goto LAB_008f7484;
      }
      uVar83 = (ulong)(uVar90 - 1);
      lVar88 = uVar83 * 0x60;
      auVar108 = *(undefined1 (*) [32])(auStack_160 + lVar88);
      auVar114._0_4_ = fVar262 + auVar108._0_4_;
      auVar114._4_4_ = fVar279 + auVar108._4_4_;
      auVar114._8_4_ = fVar283 + auVar108._8_4_;
      auVar114._12_4_ = fVar287 + auVar108._12_4_;
      auVar114._16_4_ = fVar290 + auVar108._16_4_;
      auVar114._20_4_ = fVar293 + auVar108._20_4_;
      auVar114._24_4_ = fVar296 + auVar108._24_4_;
      auVar114._28_4_ = fVar316 + auVar108._28_4_;
      uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar196._4_4_ = uVar89;
      auVar196._0_4_ = uVar89;
      auVar196._8_4_ = uVar89;
      auVar196._12_4_ = uVar89;
      auVar196._16_4_ = uVar89;
      auVar196._20_4_ = uVar89;
      auVar196._24_4_ = uVar89;
      auVar196._28_4_ = uVar89;
      auVar144 = vcmpps_avx(auVar114,auVar196,2);
      auVar109 = vandps_avx(auVar144,*(undefined1 (*) [32])(auStack_180 + lVar88));
      _local_760 = auVar109;
      auVar144 = *(undefined1 (*) [32])(auStack_180 + lVar88) & auVar144;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') break;
      uVar83 = (ulong)(uVar90 - 1);
    }
    auVar168._8_4_ = 0x7f800000;
    auVar168._0_8_ = 0x7f8000007f800000;
    auVar168._12_4_ = 0x7f800000;
    auVar168._16_4_ = 0x7f800000;
    auVar168._20_4_ = 0x7f800000;
    auVar168._24_4_ = 0x7f800000;
    auVar168._28_4_ = 0x7f800000;
    auVar108 = vblendvps_avx(auVar168,auVar108,auVar109);
    auVar144 = vshufps_avx(auVar108,auVar108,0xb1);
    auVar144 = vminps_avx(auVar108,auVar144);
    auVar302 = vshufpd_avx(auVar144,auVar144,5);
    auVar144 = vminps_avx(auVar144,auVar302);
    auVar302 = vperm2f128_avx(auVar144,auVar144,1);
    auVar144 = vminps_avx(auVar144,auVar302);
    auVar108 = vcmpps_avx(auVar108,auVar144,0);
    auVar144 = auVar109 & auVar108;
    if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0x7f,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar144 >> 0xbf,0) != '\0') ||
        (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar144[0x1f] < '\0') {
      auVar109 = vandps_avx(auVar108,auVar109);
    }
    auVar131._8_8_ = 0;
    auVar131._0_8_ = (&uStack_140)[uVar83 * 0xc];
    local_c48 = auStack_138[uVar83 * 0x18];
    uVar85 = vmovmskps_avx(auVar109);
    uVar81 = 0;
    if (uVar85 != 0) {
      for (; (uVar85 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
      }
    }
    *(undefined4 *)(local_760 + (ulong)uVar81 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar88) = _local_760;
    uVar85 = uVar90 - 1;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar85 = uVar90;
    }
    auVar184 = vshufps_avx(auVar131,auVar131,0);
    auVar265 = vshufps_avx(auVar131,auVar131,0x55);
    auVar265 = vsubps_avx(auVar265,auVar184);
    local_4c0._4_4_ = auVar184._4_4_ + auVar265._4_4_ * 0.14285715;
    local_4c0._0_4_ = auVar184._0_4_ + auVar265._0_4_ * 0.0;
    fStack_4b8 = auVar184._8_4_ + auVar265._8_4_ * 0.2857143;
    fStack_4b4 = auVar184._12_4_ + auVar265._12_4_ * 0.42857146;
    fStack_4b0 = auVar184._0_4_ + auVar265._0_4_ * 0.5714286;
    fStack_4ac = auVar184._4_4_ + auVar265._4_4_ * 0.71428573;
    fStack_4a8 = auVar184._8_4_ + auVar265._8_4_ * 0.8571429;
    fStack_4a4 = auVar184._12_4_ + auVar265._12_4_;
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar81 * 4);
    uVar83 = (ulong)uVar85;
    auVar302 = auVar355._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }